

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O3

void ImGui::ShowDemoWindow(bool *p_open)

{
  undefined8 uVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  bool bVar26;
  bool bVar27;
  bool bVar28;
  ImGuiID id;
  ImU32 IVar29;
  ImU32 IVar30;
  ImGuiMouseCursor IVar31;
  ImGuiIO *pIVar32;
  ImGuiViewport *pIVar33;
  ImDrawList *pIVar34;
  ImGuiStyle *pIVar35;
  void *pvVar36;
  ImGuiKeyData *pIVar37;
  char cVar38;
  uint uVar39;
  long lVar40;
  ulong uVar41;
  char *pcVar42;
  int n;
  int obj_i;
  int iVar43;
  ImGuiKey key;
  bool *pbVar44;
  int i;
  ImGuiWindowFlags flags;
  long lVar45;
  char *pcVar46;
  char *pcVar47;
  int i_8;
  int i_2;
  long lVar48;
  undefined8 *puVar49;
  MyDocument *doc;
  long lVar50;
  undefined **ppuVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  double dVar55;
  undefined4 extraout_XMM0_Db;
  ImVec2 IVar56;
  ImVec2 IVar57;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  int iVar68;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined4 extraout_XMM0_Dd;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  uint uVar74;
  ulong uVar72;
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  int iVar91;
  undefined1 auVar89 [16];
  int iVar92;
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  int iVar106;
  int iVar110;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  ImVec2 canvas_sz;
  ImVec2 gradient_size;
  char label [128];
  float local_158;
  float fStack_154;
  undefined4 uStack_14c;
  ImVec2 local_148;
  ImVec2 local_140;
  ImVec2 local_138 [2];
  undefined1 local_128 [8];
  undefined8 uStack_120;
  ImVec2 local_110;
  undefined1 local_108 [8];
  undefined8 uStack_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  int local_dc;
  undefined1 local_d8 [8];
  ImVec2 IStack_d0;
  ImVec2 local_c8;
  ImVec2 IStack_c0;
  char *local_b8;
  char *pcStack_b0;
  char *local_a8;
  bool *local_58;
  float local_4c;
  ImVec2 local_48;
  undefined8 uStack_40;
  long lVar70;
  
  if ((ShowDemoWindow::show_app_main_menu_bar) && (bVar26 = BeginMainMenuBar(), bVar26)) {
    bVar26 = BeginMenu("File",true);
    if (bVar26) {
      ShowExampleMenuFile();
      EndMenu();
    }
    bVar26 = BeginMenu("Edit",true);
    if (bVar26) {
      MenuItem("Undo","CTRL+Z",false,true);
      MenuItem("Redo","CTRL+Y",false,false);
      Separator();
      MenuItem("Cut","CTRL+X",false,true);
      MenuItem("Copy","CTRL+C",false,true);
      MenuItem("Paste","CTRL+V",false,true);
      EndMenu();
    }
    EndMainMenuBar();
  }
  if (ShowDemoWindow::show_app_documents == true) {
    if ((ShowExampleAppDocuments(bool*)::app == '\0') &&
       (iVar43 = __cxa_guard_acquire(&ShowExampleAppDocuments(bool*)::app), iVar43 != 0)) {
      ExampleAppDocuments::ExampleAppDocuments
                ((ExampleAppDocuments *)&ShowExampleAppDocuments(bool*)::app);
      __cxa_atexit(ExampleAppDocuments::~ExampleAppDocuments,&ShowExampleAppDocuments(bool*)::app,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppDocuments(bool*)::app);
    }
    bVar26 = Begin("Example: Documents",&ShowDemoWindow::show_app_documents,0x400);
    if (bVar26) {
      bVar26 = BeginMenuBar();
      if (bVar26) {
        bVar26 = BeginMenu("File",true);
        if (bVar26) {
          if ((long)ShowExampleAppDocuments(bool*)::app < 1) {
            iVar43 = 0;
          }
          else {
            lVar45 = 0;
            iVar43 = 0;
            do {
              iVar43 = iVar43 + (uint)*(byte *)(DAT_001b53b8 + 8 + lVar45);
              lVar45 = lVar45 + 0x20;
            } while ((long)ShowExampleAppDocuments(bool*)::app << 5 != lVar45);
          }
          bVar26 = BeginMenu("Open",iVar43 < ShowExampleAppDocuments(bool*)::app);
          if (bVar26) {
            if (0 < ShowExampleAppDocuments(bool*)::app) {
              lVar48 = 8;
              lVar50 = 0;
              lVar45 = DAT_001b53b8;
              do {
                lVar40 = lVar45;
                if ((*(char *)(lVar45 + lVar48) == '\0') &&
                   (bVar26 = MenuItem(*(char **)(lVar45 + -8 + lVar48),(char *)0x0,false,true),
                   lVar40 = DAT_001b53b8, bVar26)) {
                  *(undefined1 *)(lVar45 + lVar48) = 1;
                }
                lVar50 = lVar50 + 1;
                lVar48 = lVar48 + 0x20;
                lVar45 = lVar40;
              } while (lVar50 < ShowExampleAppDocuments(bool*)::app);
            }
            EndMenu();
          }
          bVar26 = MenuItem("Close All Documents",(char *)0x0,false,iVar43 != 0);
          lVar45 = DAT_001b53b8;
          auVar25 = _DAT_0017b730;
          if ((bVar26) && (0 < (long)ShowExampleAppDocuments(bool*)::app)) {
            uVar39 = ShowExampleAppDocuments(bool*)::app + 0xf;
            lVar48 = (long)ShowExampleAppDocuments(bool*)::app + -1;
            auVar58._8_4_ = (int)lVar48;
            auVar58._0_8_ = lVar48;
            auVar58._12_4_ = (int)((ulong)lVar48 >> 0x20);
            lVar48 = 0;
            auVar59 = auVar58;
            auVar69 = _DAT_001856a0;
            auVar71 = _DAT_001856b0;
            auVar73 = _DAT_001856c0;
            auVar75 = _DAT_001856d0;
            auVar76 = _DAT_001856e0;
            auVar77 = _DAT_001856f0;
            auVar78 = _DAT_00185700;
            auVar79 = _DAT_0017ec20;
            do {
              auVar89 = auVar58 ^ auVar25;
              auVar93 = auVar79 ^ auVar25;
              iVar43 = auVar89._0_4_;
              iVar106 = -(uint)(iVar43 < auVar93._0_4_);
              iVar68 = auVar89._4_4_;
              auVar95._4_4_ = -(uint)(iVar68 < auVar93._4_4_);
              iVar91 = auVar89._8_4_;
              iVar110 = -(uint)(iVar91 < auVar93._8_4_);
              iVar92 = auVar89._12_4_;
              auVar95._12_4_ = -(uint)(iVar92 < auVar93._12_4_);
              auVar89._4_4_ = iVar106;
              auVar89._0_4_ = iVar106;
              auVar89._8_4_ = iVar110;
              auVar89._12_4_ = iVar110;
              auVar89 = pshuflw(auVar59,auVar89,0xe8);
              auVar94._4_4_ = -(uint)(auVar93._4_4_ == iVar68);
              auVar94._12_4_ = -(uint)(auVar93._12_4_ == iVar92);
              auVar94._0_4_ = auVar94._4_4_;
              auVar94._8_4_ = auVar94._12_4_;
              auVar80 = pshuflw(in_XMM11,auVar94,0xe8);
              auVar95._0_4_ = auVar95._4_4_;
              auVar95._8_4_ = auVar95._12_4_;
              auVar93 = pshuflw(auVar89,auVar95,0xe8);
              auVar59._8_4_ = 0xffffffff;
              auVar59._0_8_ = 0xffffffffffffffff;
              auVar59._12_4_ = 0xffffffff;
              auVar59 = (auVar93 | auVar80 & auVar89) ^ auVar59;
              auVar59 = packssdw(auVar59,auVar59);
              if ((auVar59 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar45 + 0xb + lVar48) = 1;
              }
              auVar80._4_4_ = iVar106;
              auVar80._0_4_ = iVar106;
              auVar80._8_4_ = iVar110;
              auVar80._12_4_ = iVar110;
              auVar95 = auVar94 & auVar80 | auVar95;
              auVar59 = packssdw(auVar95,auVar95);
              auVar93._8_4_ = 0xffffffff;
              auVar93._0_8_ = 0xffffffffffffffff;
              auVar93._12_4_ = 0xffffffff;
              auVar59 = packssdw(auVar59 ^ auVar93,auVar59 ^ auVar93);
              auVar59 = packsswb(auVar59,auVar59);
              if ((auVar59._0_4_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar45 + 0x2b + lVar48) = 1;
              }
              auVar59 = auVar78 ^ auVar25;
              auVar81._0_4_ = -(uint)(iVar43 < auVar59._0_4_);
              auVar81._4_4_ = -(uint)(iVar68 < auVar59._4_4_);
              auVar81._8_4_ = -(uint)(iVar91 < auVar59._8_4_);
              auVar81._12_4_ = -(uint)(iVar92 < auVar59._12_4_);
              auVar96._4_4_ = auVar81._0_4_;
              auVar96._0_4_ = auVar81._0_4_;
              auVar96._8_4_ = auVar81._8_4_;
              auVar96._12_4_ = auVar81._8_4_;
              iVar106 = -(uint)(auVar59._4_4_ == iVar68);
              iVar110 = -(uint)(auVar59._12_4_ == iVar92);
              auVar12._4_4_ = iVar106;
              auVar12._0_4_ = iVar106;
              auVar12._8_4_ = iVar110;
              auVar12._12_4_ = iVar110;
              auVar107._4_4_ = auVar81._4_4_;
              auVar107._0_4_ = auVar81._4_4_;
              auVar107._8_4_ = auVar81._12_4_;
              auVar107._12_4_ = auVar81._12_4_;
              auVar59 = auVar12 & auVar96 | auVar107;
              auVar59 = packssdw(auVar59,auVar59);
              auVar3._8_4_ = 0xffffffff;
              auVar3._0_8_ = 0xffffffffffffffff;
              auVar3._12_4_ = 0xffffffff;
              auVar59 = packssdw(auVar59 ^ auVar3,auVar59 ^ auVar3);
              auVar59 = packsswb(auVar59,auVar59);
              if ((auVar59._0_4_ >> 0x10 & 1) != 0) {
                *(undefined1 *)(lVar45 + 0x4b + lVar48) = 1;
              }
              auVar59 = pshufhw(auVar59,auVar96,0x84);
              auVar13._4_4_ = iVar106;
              auVar13._0_4_ = iVar106;
              auVar13._8_4_ = iVar110;
              auVar13._12_4_ = iVar110;
              auVar93 = pshufhw(auVar81,auVar13,0x84);
              auVar89 = pshufhw(auVar59,auVar107,0x84);
              auVar60._8_4_ = 0xffffffff;
              auVar60._0_8_ = 0xffffffffffffffff;
              auVar60._12_4_ = 0xffffffff;
              auVar60 = (auVar89 | auVar93 & auVar59) ^ auVar60;
              auVar59 = packssdw(auVar60,auVar60);
              auVar59 = packsswb(auVar59,auVar59);
              if ((auVar59._0_4_ >> 0x18 & 1) != 0) {
                *(undefined1 *)(lVar45 + 0x6b + lVar48) = 1;
              }
              auVar59 = auVar77 ^ auVar25;
              auVar82._0_4_ = -(uint)(iVar43 < auVar59._0_4_);
              auVar82._4_4_ = -(uint)(iVar68 < auVar59._4_4_);
              auVar82._8_4_ = -(uint)(iVar91 < auVar59._8_4_);
              auVar82._12_4_ = -(uint)(iVar92 < auVar59._12_4_);
              auVar14._4_4_ = auVar82._0_4_;
              auVar14._0_4_ = auVar82._0_4_;
              auVar14._8_4_ = auVar82._8_4_;
              auVar14._12_4_ = auVar82._8_4_;
              auVar93 = pshuflw(auVar107,auVar14,0xe8);
              auVar61._0_4_ = -(uint)(auVar59._0_4_ == iVar43);
              auVar61._4_4_ = -(uint)(auVar59._4_4_ == iVar68);
              auVar61._8_4_ = -(uint)(auVar59._8_4_ == iVar91);
              auVar61._12_4_ = -(uint)(auVar59._12_4_ == iVar92);
              auVar97._4_4_ = auVar61._4_4_;
              auVar97._0_4_ = auVar61._4_4_;
              auVar97._8_4_ = auVar61._12_4_;
              auVar97._12_4_ = auVar61._12_4_;
              auVar59 = pshuflw(auVar61,auVar97,0xe8);
              auVar98._4_4_ = auVar82._4_4_;
              auVar98._0_4_ = auVar82._4_4_;
              auVar98._8_4_ = auVar82._12_4_;
              auVar98._12_4_ = auVar82._12_4_;
              auVar89 = pshuflw(auVar82,auVar98,0xe8);
              auVar4._8_4_ = 0xffffffff;
              auVar4._0_8_ = 0xffffffffffffffff;
              auVar4._12_4_ = 0xffffffff;
              auVar59 = packssdw(auVar59 & auVar93,(auVar89 | auVar59 & auVar93) ^ auVar4);
              auVar59 = packsswb(auVar59,auVar59);
              if ((auVar59 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar45 + 0x8b + lVar48) = 1;
              }
              auVar15._4_4_ = auVar82._0_4_;
              auVar15._0_4_ = auVar82._0_4_;
              auVar15._8_4_ = auVar82._8_4_;
              auVar15._12_4_ = auVar82._8_4_;
              auVar98 = auVar97 & auVar15 | auVar98;
              auVar89 = packssdw(auVar98,auVar98);
              auVar5._8_4_ = 0xffffffff;
              auVar5._0_8_ = 0xffffffffffffffff;
              auVar5._12_4_ = 0xffffffff;
              auVar59 = packssdw(auVar59,auVar89 ^ auVar5);
              auVar59 = packsswb(auVar59,auVar59);
              if ((auVar59._4_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar45 + 0xab + lVar48) = 1;
              }
              auVar59 = auVar76 ^ auVar25;
              auVar83._0_4_ = -(uint)(iVar43 < auVar59._0_4_);
              auVar83._4_4_ = -(uint)(iVar68 < auVar59._4_4_);
              auVar83._8_4_ = -(uint)(iVar91 < auVar59._8_4_);
              auVar83._12_4_ = -(uint)(iVar92 < auVar59._12_4_);
              auVar99._4_4_ = auVar83._0_4_;
              auVar99._0_4_ = auVar83._0_4_;
              auVar99._8_4_ = auVar83._8_4_;
              auVar99._12_4_ = auVar83._8_4_;
              iVar106 = -(uint)(auVar59._4_4_ == iVar68);
              iVar110 = -(uint)(auVar59._12_4_ == iVar92);
              auVar16._4_4_ = iVar106;
              auVar16._0_4_ = iVar106;
              auVar16._8_4_ = iVar110;
              auVar16._12_4_ = iVar110;
              auVar108._4_4_ = auVar83._4_4_;
              auVar108._0_4_ = auVar83._4_4_;
              auVar108._8_4_ = auVar83._12_4_;
              auVar108._12_4_ = auVar83._12_4_;
              auVar59 = auVar16 & auVar99 | auVar108;
              auVar59 = packssdw(auVar59,auVar59);
              auVar6._8_4_ = 0xffffffff;
              auVar6._0_8_ = 0xffffffffffffffff;
              auVar6._12_4_ = 0xffffffff;
              auVar59 = packssdw(auVar59 ^ auVar6,auVar59 ^ auVar6);
              auVar59 = packsswb(auVar59,auVar59);
              if ((auVar59 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar45 + 0xcb + lVar48) = 1;
              }
              auVar59 = pshufhw(auVar59,auVar99,0x84);
              auVar17._4_4_ = iVar106;
              auVar17._0_4_ = iVar106;
              auVar17._8_4_ = iVar110;
              auVar17._12_4_ = iVar110;
              auVar93 = pshufhw(auVar83,auVar17,0x84);
              auVar89 = pshufhw(auVar59,auVar108,0x84);
              auVar62._8_4_ = 0xffffffff;
              auVar62._0_8_ = 0xffffffffffffffff;
              auVar62._12_4_ = 0xffffffff;
              auVar62 = (auVar89 | auVar93 & auVar59) ^ auVar62;
              auVar59 = packssdw(auVar62,auVar62);
              auVar59 = packsswb(auVar59,auVar59);
              if ((auVar59._6_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar45 + 0xeb + lVar48) = 1;
              }
              auVar59 = auVar75 ^ auVar25;
              auVar84._0_4_ = -(uint)(iVar43 < auVar59._0_4_);
              auVar84._4_4_ = -(uint)(iVar68 < auVar59._4_4_);
              auVar84._8_4_ = -(uint)(iVar91 < auVar59._8_4_);
              auVar84._12_4_ = -(uint)(iVar92 < auVar59._12_4_);
              auVar18._4_4_ = auVar84._0_4_;
              auVar18._0_4_ = auVar84._0_4_;
              auVar18._8_4_ = auVar84._8_4_;
              auVar18._12_4_ = auVar84._8_4_;
              auVar93 = pshuflw(auVar108,auVar18,0xe8);
              auVar63._0_4_ = -(uint)(auVar59._0_4_ == iVar43);
              auVar63._4_4_ = -(uint)(auVar59._4_4_ == iVar68);
              auVar63._8_4_ = -(uint)(auVar59._8_4_ == iVar91);
              auVar63._12_4_ = -(uint)(auVar59._12_4_ == iVar92);
              auVar100._4_4_ = auVar63._4_4_;
              auVar100._0_4_ = auVar63._4_4_;
              auVar100._8_4_ = auVar63._12_4_;
              auVar100._12_4_ = auVar63._12_4_;
              auVar59 = pshuflw(auVar63,auVar100,0xe8);
              auVar101._4_4_ = auVar84._4_4_;
              auVar101._0_4_ = auVar84._4_4_;
              auVar101._8_4_ = auVar84._12_4_;
              auVar101._12_4_ = auVar84._12_4_;
              auVar89 = pshuflw(auVar84,auVar101,0xe8);
              auVar85._8_4_ = 0xffffffff;
              auVar85._0_8_ = 0xffffffffffffffff;
              auVar85._12_4_ = 0xffffffff;
              auVar85 = (auVar89 | auVar59 & auVar93) ^ auVar85;
              auVar89 = packssdw(auVar85,auVar85);
              auVar59 = packsswb(auVar59 & auVar93,auVar89);
              if ((auVar59 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar45 + 0x10b + lVar48) = 1;
              }
              auVar19._4_4_ = auVar84._0_4_;
              auVar19._0_4_ = auVar84._0_4_;
              auVar19._8_4_ = auVar84._8_4_;
              auVar19._12_4_ = auVar84._8_4_;
              auVar101 = auVar100 & auVar19 | auVar101;
              auVar89 = packssdw(auVar101,auVar101);
              auVar7._8_4_ = 0xffffffff;
              auVar7._0_8_ = 0xffffffffffffffff;
              auVar7._12_4_ = 0xffffffff;
              auVar89 = packssdw(auVar89 ^ auVar7,auVar89 ^ auVar7);
              auVar59 = packsswb(auVar59,auVar89);
              if ((auVar59._8_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar45 + 299 + lVar48) = 1;
              }
              auVar59 = auVar73 ^ auVar25;
              auVar86._0_4_ = -(uint)(iVar43 < auVar59._0_4_);
              auVar86._4_4_ = -(uint)(iVar68 < auVar59._4_4_);
              auVar86._8_4_ = -(uint)(iVar91 < auVar59._8_4_);
              auVar86._12_4_ = -(uint)(iVar92 < auVar59._12_4_);
              auVar102._4_4_ = auVar86._0_4_;
              auVar102._0_4_ = auVar86._0_4_;
              auVar102._8_4_ = auVar86._8_4_;
              auVar102._12_4_ = auVar86._8_4_;
              iVar106 = -(uint)(auVar59._4_4_ == iVar68);
              iVar110 = -(uint)(auVar59._12_4_ == iVar92);
              auVar20._4_4_ = iVar106;
              auVar20._0_4_ = iVar106;
              auVar20._8_4_ = iVar110;
              auVar20._12_4_ = iVar110;
              auVar109._4_4_ = auVar86._4_4_;
              auVar109._0_4_ = auVar86._4_4_;
              auVar109._8_4_ = auVar86._12_4_;
              auVar109._12_4_ = auVar86._12_4_;
              auVar59 = auVar20 & auVar102 | auVar109;
              auVar59 = packssdw(auVar59,auVar59);
              auVar8._8_4_ = 0xffffffff;
              auVar8._0_8_ = 0xffffffffffffffff;
              auVar8._12_4_ = 0xffffffff;
              auVar59 = packssdw(auVar59 ^ auVar8,auVar59 ^ auVar8);
              auVar59 = packsswb(auVar59,auVar59);
              if ((auVar59 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar45 + 0x14b + lVar48) = 1;
              }
              auVar59 = pshufhw(auVar59,auVar102,0x84);
              auVar21._4_4_ = iVar106;
              auVar21._0_4_ = iVar106;
              auVar21._8_4_ = iVar110;
              auVar21._12_4_ = iVar110;
              auVar93 = pshufhw(auVar86,auVar21,0x84);
              auVar89 = pshufhw(auVar59,auVar109,0x84);
              auVar64._8_4_ = 0xffffffff;
              auVar64._0_8_ = 0xffffffffffffffff;
              auVar64._12_4_ = 0xffffffff;
              auVar64 = (auVar89 | auVar93 & auVar59) ^ auVar64;
              auVar59 = packssdw(auVar64,auVar64);
              auVar59 = packsswb(auVar59,auVar59);
              if ((auVar59._10_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar45 + 0x16b + lVar48) = 1;
              }
              auVar59 = auVar71 ^ auVar25;
              auVar87._0_4_ = -(uint)(iVar43 < auVar59._0_4_);
              auVar87._4_4_ = -(uint)(iVar68 < auVar59._4_4_);
              auVar87._8_4_ = -(uint)(iVar91 < auVar59._8_4_);
              auVar87._12_4_ = -(uint)(iVar92 < auVar59._12_4_);
              auVar22._4_4_ = auVar87._0_4_;
              auVar22._0_4_ = auVar87._0_4_;
              auVar22._8_4_ = auVar87._8_4_;
              auVar22._12_4_ = auVar87._8_4_;
              auVar93 = pshuflw(auVar109,auVar22,0xe8);
              auVar65._0_4_ = -(uint)(auVar59._0_4_ == iVar43);
              auVar65._4_4_ = -(uint)(auVar59._4_4_ == iVar68);
              auVar65._8_4_ = -(uint)(auVar59._8_4_ == iVar91);
              auVar65._12_4_ = -(uint)(auVar59._12_4_ == iVar92);
              auVar103._4_4_ = auVar65._4_4_;
              auVar103._0_4_ = auVar65._4_4_;
              auVar103._8_4_ = auVar65._12_4_;
              auVar103._12_4_ = auVar65._12_4_;
              auVar59 = pshuflw(auVar65,auVar103,0xe8);
              auVar104._4_4_ = auVar87._4_4_;
              auVar104._0_4_ = auVar87._4_4_;
              auVar104._8_4_ = auVar87._12_4_;
              auVar104._12_4_ = auVar87._12_4_;
              auVar89 = pshuflw(auVar87,auVar104,0xe8);
              auVar9._8_4_ = 0xffffffff;
              auVar9._0_8_ = 0xffffffffffffffff;
              auVar9._12_4_ = 0xffffffff;
              auVar59 = packssdw(auVar59 & auVar93,(auVar89 | auVar59 & auVar93) ^ auVar9);
              auVar59 = packsswb(auVar59,auVar59);
              if ((auVar59 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar45 + 0x18b + lVar48) = 1;
              }
              auVar23._4_4_ = auVar87._0_4_;
              auVar23._0_4_ = auVar87._0_4_;
              auVar23._8_4_ = auVar87._8_4_;
              auVar23._12_4_ = auVar87._8_4_;
              auVar104 = auVar103 & auVar23 | auVar104;
              auVar89 = packssdw(auVar104,auVar104);
              auVar10._8_4_ = 0xffffffff;
              auVar10._0_8_ = 0xffffffffffffffff;
              auVar10._12_4_ = 0xffffffff;
              auVar59 = packssdw(auVar59,auVar89 ^ auVar10);
              auVar59 = packsswb(auVar59,auVar59);
              if ((auVar59._12_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar45 + 0x1ab + lVar48) = 1;
              }
              auVar59 = auVar69 ^ auVar25;
              auVar88._0_4_ = -(uint)(iVar43 < auVar59._0_4_);
              auVar88._4_4_ = -(uint)(iVar68 < auVar59._4_4_);
              auVar88._8_4_ = -(uint)(iVar91 < auVar59._8_4_);
              auVar88._12_4_ = -(uint)(iVar92 < auVar59._12_4_);
              auVar105._4_4_ = auVar88._0_4_;
              auVar105._0_4_ = auVar88._0_4_;
              auVar105._8_4_ = auVar88._8_4_;
              auVar105._12_4_ = auVar88._8_4_;
              iVar43 = -(uint)(auVar59._4_4_ == iVar68);
              iVar68 = -(uint)(auVar59._12_4_ == iVar92);
              auVar90._4_4_ = iVar43;
              auVar90._0_4_ = iVar43;
              auVar90._8_4_ = iVar68;
              auVar90._12_4_ = iVar68;
              auVar66._4_4_ = auVar88._4_4_;
              auVar66._0_4_ = auVar88._4_4_;
              auVar66._8_4_ = auVar88._12_4_;
              auVar66._12_4_ = auVar88._12_4_;
              auVar66 = auVar90 & auVar105 | auVar66;
              auVar59 = packssdw(auVar66,auVar66);
              auVar11._8_4_ = 0xffffffff;
              auVar11._0_8_ = 0xffffffffffffffff;
              auVar11._12_4_ = 0xffffffff;
              auVar59 = packssdw(auVar59 ^ auVar11,auVar59 ^ auVar11);
              auVar59 = packsswb(auVar59,auVar59);
              if ((auVar59 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined1 *)(lVar45 + 0x1cb + lVar48) = 1;
              }
              auVar59 = pshufhw(auVar59,auVar105,0x84);
              in_XMM11 = pshufhw(auVar88,auVar90,0x84);
              in_XMM11 = in_XMM11 & auVar59;
              auVar24._4_4_ = auVar88._4_4_;
              auVar24._0_4_ = auVar88._4_4_;
              auVar24._8_4_ = auVar88._12_4_;
              auVar24._12_4_ = auVar88._12_4_;
              auVar59 = pshufhw(auVar59,auVar24,0x84);
              auVar67._8_4_ = 0xffffffff;
              auVar67._0_8_ = 0xffffffffffffffff;
              auVar67._12_4_ = 0xffffffff;
              auVar67 = (auVar59 | in_XMM11) ^ auVar67;
              auVar59 = packssdw(auVar67,auVar67);
              auVar59 = packsswb(auVar59,auVar59);
              if ((auVar59._14_2_ >> 8 & 1) != 0) {
                *(undefined1 *)(lVar45 + 0x1eb + lVar48) = 1;
              }
              lVar50 = (long)DAT_00185710;
              lVar70 = auVar79._8_8_;
              auVar79._0_8_ = auVar79._0_8_ + lVar50;
              lVar40 = DAT_00185710._8_8_;
              auVar79._8_8_ = lVar70 + lVar40;
              lVar70 = auVar78._8_8_;
              auVar78._0_8_ = auVar78._0_8_ + lVar50;
              auVar78._8_8_ = lVar70 + lVar40;
              lVar70 = auVar77._8_8_;
              auVar77._0_8_ = auVar77._0_8_ + lVar50;
              auVar77._8_8_ = lVar70 + lVar40;
              lVar70 = auVar76._8_8_;
              auVar76._0_8_ = auVar76._0_8_ + lVar50;
              auVar76._8_8_ = lVar70 + lVar40;
              lVar70 = auVar75._8_8_;
              auVar75._0_8_ = auVar75._0_8_ + lVar50;
              auVar75._8_8_ = lVar70 + lVar40;
              lVar70 = auVar73._8_8_;
              auVar73._0_8_ = auVar73._0_8_ + lVar50;
              auVar73._8_8_ = lVar70 + lVar40;
              lVar70 = auVar71._8_8_;
              auVar71._0_8_ = auVar71._0_8_ + lVar50;
              auVar71._8_8_ = lVar70 + lVar40;
              lVar70 = auVar69._8_8_;
              auVar69._0_8_ = auVar69._0_8_ + lVar50;
              auVar69._8_8_ = lVar70 + lVar40;
              lVar48 = lVar48 + 0x200;
              auVar59 = _DAT_00185710;
            } while ((ulong)(uVar39 >> 4) << 9 != lVar48);
          }
          MenuItem("Exit","Alt+F4",false,true);
          EndMenu();
        }
        EndMenuBar();
      }
      local_58 = p_open;
      if (0 < ShowExampleAppDocuments(bool*)::app) {
        lVar48 = 8;
        lVar45 = 0;
        do {
          lVar50 = DAT_001b53b8;
          if (lVar45 != 0) {
            SameLine(0.0,-1.0);
          }
          puVar49 = (undefined8 *)(lVar48 + lVar50 + -8);
          PushID(puVar49);
          bVar26 = Checkbox((char *)*puVar49,(bool *)(lVar48 + lVar50));
          if ((bVar26) && (*(bool *)(lVar48 + lVar50) == false)) {
            *(undefined1 *)(lVar50 + lVar48) = 0;
            *(undefined1 *)(lVar50 + 2 + lVar48) = 0;
          }
          PopID();
          lVar45 = lVar45 + 1;
          lVar48 = lVar48 + 0x20;
        } while (lVar45 < ShowExampleAppDocuments(bool*)::app);
      }
      Separator();
      bVar26 = BeginTabBar("##tabs",0x41);
      p_open = local_58;
      if (bVar26) {
        if (0 < ShowExampleAppDocuments(bool*)::app) {
          lVar48 = 9;
          lVar50 = 0;
          lVar45 = DAT_001b53b8;
          iVar43 = ShowExampleAppDocuments(bool*)::app;
          do {
            cVar38 = *(char *)(lVar45 + -1 + lVar48);
            lVar40 = lVar45;
            if ((cVar38 == '\0') && (*(char *)(lVar45 + lVar48) == '\x01')) {
              SetTabItemClosed(*(char **)(lVar45 + -9 + lVar48));
              cVar38 = *(char *)(lVar45 + -1 + lVar48);
              lVar40 = DAT_001b53b8;
              iVar43 = ShowExampleAppDocuments(bool*)::app;
            }
            *(char *)(lVar45 + lVar48) = cVar38;
            lVar50 = lVar50 + 1;
            lVar48 = lVar48 + 0x20;
            lVar45 = lVar40;
          } while (lVar50 < iVar43);
          if (0 < iVar43) {
            lVar48 = 8;
            lVar45 = 0;
            do {
              lVar50 = DAT_001b53b8;
              if (*(char *)(DAT_001b53b8 + lVar48) == '\x01') {
                bVar26 = BeginTabItem(*(char **)(DAT_001b53b8 + -8 + lVar48),
                                      (bool *)(DAT_001b53b8 + lVar48),
                                      (uint)*(byte *)(DAT_001b53b8 + 2 + lVar48));
                if ((*(char *)(lVar50 + lVar48) == '\0') &&
                   (*(char *)(lVar50 + 2 + lVar48) == '\x01')) {
                  *(undefined1 *)(lVar50 + lVar48) = 1;
                  *(undefined1 *)(lVar50 + 3 + lVar48) = 1;
                }
                doc = (MyDocument *)(lVar50 + lVar48 + -8);
                MyDocument::DisplayContextMenu(doc);
                if (bVar26) {
                  MyDocument::DisplayContents(doc);
                  EndTabItem();
                }
              }
              lVar45 = lVar45 + 1;
              lVar48 = lVar48 + 0x20;
            } while (lVar45 < ShowExampleAppDocuments(bool*)::app);
          }
        }
        EndTabBar();
      }
      if (ShowExampleAppDocuments(bool*)::close_queue == '\0') {
        ShowDemoWindow();
      }
      uVar72 = _close_queue & 0xffffffff;
      if (ShowExampleAppDocuments(bool*)::close_queue == 0) {
        if (0 < ShowExampleAppDocuments(bool*)::app) {
          lVar50 = 0;
          uVar72 = 0;
          lVar48 = 0;
          lVar45 = DAT_001b53b8;
          iVar43 = ShowExampleAppDocuments(bool*)::app;
          do {
            iVar68 = (int)uVar72;
            if (*(char *)(lVar45 + 0xb + lVar50) == '\x01') {
              *(undefined1 *)(lVar45 + 0xb + lVar50) = 0;
              if (iVar68 == DAT_001b53cc) {
                if (iVar68 == 0) {
                  iVar43 = 8;
                }
                else {
                  iVar43 = ((int)(uVar72 >> 0x1f) + iVar68 >> 1) + iVar68;
                }
                iVar91 = iVar68 + 1;
                if (iVar68 + 1 < iVar43) {
                  iVar91 = iVar43;
                }
                pvVar36 = MemAlloc((long)iVar91 << 3);
                if (DAT_001b53d0 != (void *)0x0) {
                  memcpy(pvVar36,DAT_001b53d0,(long)ShowExampleAppDocuments(bool*)::close_queue << 3
                        );
                  MemFree(DAT_001b53d0);
                }
                _close_queue = CONCAT44(iVar91,ShowExampleAppDocuments(bool*)::close_queue);
                iVar68 = ShowExampleAppDocuments(bool*)::close_queue;
                DAT_001b53d0 = pvVar36;
              }
              *(long *)((long)DAT_001b53d0 + (long)iVar68 * 8) = lVar45 + lVar50;
              uVar72 = (ulong)(ShowExampleAppDocuments(bool*)::close_queue + 1U);
              _close_queue = CONCAT44(DAT_001b53cc,ShowExampleAppDocuments(bool*)::close_queue + 1U)
              ;
              lVar45 = DAT_001b53b8;
              iVar43 = ShowExampleAppDocuments(bool*)::app;
            }
            lVar48 = lVar48 + 1;
            lVar50 = lVar50 + 0x20;
          } while (lVar48 < iVar43);
          if ((int)uVar72 != 0) goto LAB_00139e07;
        }
      }
      else {
LAB_00139e07:
        pvVar36 = DAT_001b53d0;
        if ((int)uVar72 < 1) {
          if (DAT_001b53d0 != (void *)0x0) goto LAB_0013a092;
        }
        else {
          uVar41 = 0;
          iVar43 = 0;
          do {
            iVar43 = iVar43 + (uint)*(byte *)(*(long *)((long)DAT_001b53d0 + uVar41 * 8) + 10);
            uVar41 = uVar41 + 1;
          } while (uVar72 != uVar41);
          if (iVar43 == 0) {
            uVar41 = 0;
            do {
              lVar45 = *(long *)((long)pvVar36 + uVar41 * 8);
              *(undefined1 *)(lVar45 + 8) = 0;
              *(undefined1 *)(lVar45 + 10) = 0;
              uVar41 = uVar41 + 1;
            } while (uVar72 != uVar41);
LAB_0013a092:
            _close_queue = 0;
            MemFree(pvVar36);
            DAT_001b53d0 = (void *)0x0;
          }
          else {
            bVar26 = IsPopupOpen("Save?",0);
            if (!bVar26) {
              OpenPopup("Save?",0);
            }
            bVar26 = BeginPopupModal("Save?",(bool *)0x0,0x40);
            if (!bVar26) goto LAB_0013a190;
            Text("Save change to the following items?");
            fVar52 = GetTextLineHeightWithSpacing();
            id = GetID("frame");
            local_d8._4_4_ = fVar52 * 6.25;
            local_d8._0_4_ = -1.1754944e-38;
            bVar26 = BeginChildFrame(id,(ImVec2 *)local_d8,0);
            if (bVar26) {
              if (0 < ShowExampleAppDocuments(bool*)::close_queue) {
                lVar45 = 0;
                pvVar36 = DAT_001b53d0;
                iVar43 = ShowExampleAppDocuments(bool*)::close_queue;
                do {
                  puVar49 = *(undefined8 **)((long)pvVar36 + lVar45 * 8);
                  if (*(char *)((long)puVar49 + 10) == '\x01') {
                    Text("%s",*puVar49);
                    pvVar36 = DAT_001b53d0;
                    iVar43 = ShowExampleAppDocuments(bool*)::close_queue;
                  }
                  lVar45 = lVar45 + 1;
                } while (lVar45 < iVar43);
              }
              EndChildFrame();
            }
            fVar52 = GetFontSize();
            local_d8._4_4_ = 0;
            local_d8._0_4_ = fVar52 * 7.0;
            bVar26 = Button("Yes",(ImVec2 *)local_d8);
            pvVar36 = DAT_001b53d0;
            if (bVar26) {
              if ((long)ShowExampleAppDocuments(bool*)::close_queue < 1) {
                if (DAT_001b53d0 != (void *)0x0) goto LAB_0013a0b1;
              }
              else {
                lVar45 = 0;
                do {
                  lVar48 = *(long *)((long)pvVar36 + lVar45 * 8);
                  if (*(char *)(lVar48 + 10) == '\x01') {
                    *(undefined1 *)(lVar48 + 10) = 0;
                  }
                  *(undefined1 *)(lVar48 + 8) = 0;
                  *(undefined1 *)(lVar48 + 10) = 0;
                  lVar45 = lVar45 + 1;
                } while (ShowExampleAppDocuments(bool*)::close_queue != lVar45);
LAB_0013a0b1:
                _close_queue = 0;
                MemFree(pvVar36);
                DAT_001b53d0 = (void *)0x0;
              }
              CloseCurrentPopup();
            }
            SameLine(0.0,-1.0);
            bVar26 = Button("No",(ImVec2 *)local_d8);
            pvVar36 = DAT_001b53d0;
            if (bVar26) {
              if ((long)ShowExampleAppDocuments(bool*)::close_queue < 1) {
                if (DAT_001b53d0 != (void *)0x0) goto LAB_0013a123;
              }
              else {
                lVar45 = 0;
                do {
                  lVar48 = *(long *)((long)pvVar36 + lVar45 * 8);
                  *(undefined1 *)(lVar48 + 8) = 0;
                  *(undefined1 *)(lVar48 + 10) = 0;
                  lVar45 = lVar45 + 1;
                } while (ShowExampleAppDocuments(bool*)::close_queue != lVar45);
LAB_0013a123:
                _close_queue = 0;
                MemFree(pvVar36);
                DAT_001b53d0 = (void *)0x0;
              }
              CloseCurrentPopup();
            }
            SameLine(0.0,-1.0);
            bVar26 = Button("Cancel",(ImVec2 *)local_d8);
            if (bVar26) {
              if (DAT_001b53d0 != (void *)0x0) {
                _close_queue = 0;
                MemFree(DAT_001b53d0);
                DAT_001b53d0 = (void *)0x0;
              }
              CloseCurrentPopup();
            }
            EndPopup();
          }
        }
      }
    }
LAB_0013a190:
    End();
  }
  if (ShowDemoWindow::show_app_console == true) {
    if ((ShowExampleAppConsole(bool*)::console == '\0') &&
       (iVar43 = __cxa_guard_acquire(&ShowExampleAppConsole(bool*)::console), iVar43 != 0)) {
      ExampleAppConsole::ExampleAppConsole
                ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console);
      __cxa_atexit(ExampleAppConsole::~ExampleAppConsole,ShowExampleAppConsole(bool*)::console,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppConsole(bool*)::console);
    }
    ExampleAppConsole::Draw
              ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console,"Example: Console",
               &ShowDemoWindow::show_app_console);
  }
  if (ShowDemoWindow::show_app_log == true) {
    if ((ShowExampleAppLog(bool*)::log == '\0') &&
       (iVar43 = __cxa_guard_acquire(&ShowExampleAppLog(bool*)::log), iVar43 != 0)) {
      ExampleAppLog::ExampleAppLog((ExampleAppLog *)ShowExampleAppLog(bool*)::log);
      __cxa_atexit(ExampleAppLog::~ExampleAppLog,ShowExampleAppLog(bool*)::log,&__dso_handle);
      __cxa_guard_release(&ShowExampleAppLog(bool*)::log);
    }
    local_d8._0_4_ = 500.0;
    local_d8._4_4_ = 400.0;
    local_58 = p_open;
    SetNextWindowSize((ImVec2 *)local_d8,4);
    Begin("Example: Log",&ShowDemoWindow::show_app_log,0);
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x1b2d,"Examples/Log",GImGuiDemoMarkerCallbackUserData);
    }
    bVar26 = SmallButton("[Debug] Add 5 entries");
    if (bVar26) {
      iVar43 = 5;
      do {
        uVar39 = GetFrameCount();
        GetTime();
        ExampleAppLog::AddLog
                  ((ExampleAppLog *)ShowExampleAppLog(bool*)::log,
                   "[%05d] [%s] Hello, current time is %.1f, here\'s a word: \'%s\'\n",(ulong)uVar39
                  );
        ShowExampleAppLog(bool*)::counter = ShowExampleAppLog(bool*)::counter + 1;
        iVar43 = iVar43 + -1;
      } while (iVar43 != 0);
    }
    End();
    ExampleAppLog::Draw((ExampleAppLog *)ShowExampleAppLog(bool*)::log,"Example: Log",
                        &ShowDemoWindow::show_app_log);
    p_open = local_58;
  }
  if (ShowDemoWindow::show_app_layout == true) {
    local_d8._0_4_ = 500.0;
    local_d8._4_4_ = 440.0;
    SetNextWindowSize((ImVec2 *)local_d8,4);
    bVar26 = Begin("Example: Simple layout",&ShowDemoWindow::show_app_layout,0x400);
    if (bVar26) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1b4c,"Examples/Simple layout",GImGuiDemoMarkerCallbackUserData);
      }
      bVar26 = BeginMenuBar();
      if (bVar26) {
        bVar26 = BeginMenu("File",true);
        if (bVar26) {
          bVar26 = MenuItem("Close",(char *)0x0,false,true);
          if (bVar26) {
            ShowDemoWindow::show_app_layout = false;
          }
          EndMenu();
        }
        EndMenuBar();
      }
      local_d8 = SUB168(ZEXT416(0x43160000),0);
      BeginChild("left pane",(ImVec2 *)local_d8,true,0);
      uVar72 = 0;
      do {
        iVar43 = (int)uVar72;
        sprintf((char *)local_d8,"MyObject %d",uVar72);
        local_148.x = 0.0;
        local_148.y = 0.0;
        bVar26 = Selectable((char *)local_d8,iVar43 == ShowExampleAppLayout(bool*)::selected,0,
                            &local_148);
        if (bVar26) {
          ShowExampleAppLayout(bool*)::selected = iVar43;
        }
        uVar72 = (ulong)(iVar43 + 1U);
      } while (iVar43 + 1U != 100);
      EndChild();
      SameLine(0.0,-1.0);
      BeginGroup();
      fVar52 = GetFrameHeightWithSpacing();
      local_d8 = (undefined1  [8])((ulong)((uint)fVar52 ^ (uint)DAT_0017b730) << 0x20);
      BeginChild("item view",(ImVec2 *)local_d8,false,0);
      Text("MyObject: %d");
      Separator();
      bVar26 = BeginTabBar("##Tabs",0);
      if (bVar26) {
        bVar26 = BeginTabItem("Description",(bool *)0x0,0);
        if (bVar26) {
          TextWrapped(
                     "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. "
                     );
          EndTabItem();
        }
        bVar26 = BeginTabItem("Details",(bool *)0x0,0);
        if (bVar26) {
          Text("ID: 0123456789");
          EndTabItem();
        }
        EndTabBar();
      }
      EndChild();
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      Button("Revert",(ImVec2 *)local_d8);
      SameLine(0.0,-1.0);
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      Button("Save",(ImVec2 *)local_d8);
      EndGroup();
    }
    End();
  }
  if (ShowDemoWindow::show_app_property_editor == true) {
    local_d8._0_4_ = 430.0;
    local_d8._4_4_ = 450.0;
    SetNextWindowSize((ImVec2 *)local_d8,4);
    bVar26 = Begin("Example: Property editor",&ShowDemoWindow::show_app_property_editor,0);
    if (bVar26) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1bc1,"Examples/Property Editor",GImGuiDemoMarkerCallbackUserData);
      }
      HelpMarker(
                "This example shows how you may implement a property editor using two columns.\nAll objects/fields data are dummies here.\nRemember that in many simple cases, you can use ImGui::SameLine(xxx) to position\nyour cursor horizontally instead of using the Columns() API."
                );
      local_d8._0_4_ = 2.0;
      local_d8._4_4_ = 2.0;
      PushStyleVar(0xb,(ImVec2 *)local_d8);
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      bVar26 = BeginTable("split",2,0x501,(ImVec2 *)local_d8,0.0);
      if (bVar26) {
        iVar43 = 0;
        do {
          ShowPlaceholderObject("Object",iVar43);
          iVar43 = iVar43 + 1;
        } while (iVar43 != 4);
        EndTable();
      }
      PopStyleVar(1);
    }
    End();
  }
  if (ShowDemoWindow::show_app_long_text == true) {
    local_d8._0_4_ = 520.0;
    local_d8._4_4_ = 600.0;
    SetNextWindowSize((ImVec2 *)local_d8,4);
    bVar26 = Begin("Example: Long text display",&ShowDemoWindow::show_app_long_text,0);
    if (bVar26) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1be5,"Examples/Long text display",GImGuiDemoMarkerCallbackUserData);
      }
      if (ShowExampleAppLongText(bool*)::log == '\0') {
        ShowDemoWindow();
      }
      Text("Printing unusually long amount of text.");
      Combo("Test type",&ShowExampleAppLongText(bool*)::test_type,"Single call to TextUnformatted()"
            ,-1);
      uVar72 = (ulong)(ShowExampleAppLongText(bool*)::log - 1);
      if (ShowExampleAppLongText(bool*)::log == 0) {
        uVar72 = 0;
      }
      Text("Buffer contents: %d lines, %d bytes",(ulong)ShowExampleAppLongText(bool*)::lines,uVar72)
      ;
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      bVar26 = Button("Clear",(ImVec2 *)local_d8);
      if (bVar26) {
        if (DAT_001b5360 != (char *)0x0) {
          _log = 0;
          MemFree(DAT_001b5360);
          DAT_001b5360 = (char *)0x0;
        }
        ShowExampleAppLongText(bool*)::lines = 0;
      }
      SameLine(0.0,-1.0);
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      bVar26 = Button("Add 1000 lines",(ImVec2 *)local_d8);
      if (bVar26) {
        iVar43 = 0;
        do {
          ImGuiTextBuffer::appendf
                    ((ImGuiTextBuffer *)&ShowExampleAppLongText(bool*)::log,
                     "%i The quick brown fox jumps over the lazy dog\n",
                     (ulong)(ShowExampleAppLongText(bool*)::lines + iVar43));
          iVar43 = iVar43 + 1;
        } while (iVar43 != 1000);
        ShowExampleAppLongText(bool*)::lines = ShowExampleAppLongText(bool*)::lines + 1000;
      }
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      BeginChild("Log",(ImVec2 *)local_d8,false,0);
      if (ShowExampleAppLongText(bool*)::test_type == 2) {
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        PushStyleVar(0xe,(ImVec2 *)local_d8);
        if (0 < (int)ShowExampleAppLongText(bool*)::lines) {
          iVar43 = 0;
          do {
            Text("%i The quick brown fox jumps over the lazy dog");
            iVar43 = iVar43 + 1;
          } while (iVar43 < (int)ShowExampleAppLongText(bool*)::lines);
        }
        PopStyleVar(1);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 1) {
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        PushStyleVar(0xe,(ImVec2 *)local_d8);
        ImGuiListClipper::ImGuiListClipper((ImGuiListClipper *)local_d8);
        ImGuiListClipper::Begin
                  ((ImGuiListClipper *)local_d8,ShowExampleAppLongText(bool*)::lines,-1.0);
        while (bVar26 = ImGuiListClipper::Step((ImGuiListClipper *)local_d8), bVar26) {
          for (fVar52 = (float)local_d8._0_4_; (int)fVar52 < (int)local_d8._4_4_;
              fVar52 = (float)((int)fVar52 + 1)) {
            Text("%i The quick brown fox jumps over the lazy dog");
          }
        }
        PopStyleVar(1);
        ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)local_d8);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 0) {
        pcVar46 = DAT_001b5360 + (long)ShowExampleAppLongText(bool*)::log + -1;
        pcVar47 = DAT_001b5360;
        if (DAT_001b5360 == (char *)0x0) {
          pcVar47 = ImGuiTextBuffer::EmptyString;
          pcVar46 = ImGuiTextBuffer::EmptyString;
        }
        TextUnformatted(pcVar47,pcVar46);
      }
      EndChild();
    }
    End();
  }
  if (ShowDemoWindow::show_app_auto_resize == true) {
    bVar26 = Begin("Example: Auto-resizing window",&ShowDemoWindow::show_app_auto_resize,0x40);
    if (bVar26) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1c23,"Examples/Auto-resizing window",GImGuiDemoMarkerCallbackUserData);
      }
      TextUnformatted("Window will resize every-frame to the size of its content.\nNote that you probably don\'t want to query the window size to\noutput your content because that would create a feedback loop."
                      ,(char *)0x0);
      SliderInt("Number of lines",&ShowExampleAppAutoResize(bool*)::lines,1,0x14,"%d",0);
      if (0 < ShowExampleAppAutoResize(bool*)::lines) {
        uVar72 = 0;
        iVar43 = 0;
        do {
          Text("%*sThis is line %d",uVar72,"");
          iVar43 = iVar43 + 1;
          uVar72 = (ulong)((int)uVar72 + 4);
        } while (iVar43 < ShowExampleAppAutoResize(bool*)::lines);
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_constrained_resize == true) {
    local_a8 = "Custom: Fixed Steps (100)";
    local_b8 = "Height 400-500";
    pcStack_b0 = "Custom: Always Square";
    local_c8 = (ImVec2)0x191216;
    IStack_c0 = (ImVec2)0x191230;
    local_d8 = (undefined1  [8])0x1911ea;
    IStack_d0 = (ImVec2)0x1911ff;
    if (ShowExampleAppConstrainedResize(bool*)::type == 0) {
      local_148.x = -1.0;
      local_148.y = 0.0;
      local_110.x = -1.0;
      local_110.y = 3.4028235e+38;
      SetNextWindowSizeConstraints(&local_148,&local_110,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 1) {
      local_148.x = 0.0;
      local_148.y = -1.0;
      local_110.x = 3.4028235e+38;
      local_110.y = -1.0;
      SetNextWindowSizeConstraints(&local_148,&local_110,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 2) {
      local_148.x = 100.0;
      local_148.y = 100.0;
      local_110.x = 3.4028235e+38;
      local_110.y = 3.4028235e+38;
      SetNextWindowSizeConstraints(&local_148,&local_110,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 3) {
      local_148.x = 400.0;
      local_148.y = -1.0;
      local_110.x = 500.0;
      local_110.y = -1.0;
      SetNextWindowSizeConstraints(&local_148,&local_110,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 4) {
      local_148.x = -1.0;
      local_148.y = 400.0;
      local_110.x = -1.0;
      local_110.y = 500.0;
      SetNextWindowSizeConstraints(&local_148,&local_110,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 5) {
      local_148.x = 0.0;
      local_148.y = 0.0;
      local_110.x = 3.4028235e+38;
      local_110.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                (&local_148,&local_110,ShowExampleAppConstrainedResize::CustomConstraints::Square,
                 (void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 6) {
      local_148.x = 0.0;
      local_148.y = 0.0;
      local_110.x = 3.4028235e+38;
      local_110.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                (&local_148,&local_110,ShowExampleAppConstrainedResize::CustomConstraints::Step,
                 (void *)0x64);
    }
    bVar26 = Begin("Example: Constrained Resize",&ShowDemoWindow::show_app_constrained_resize,
                   (uint)ShowExampleAppConstrainedResize(bool*)::auto_resize << 6);
    if (bVar26) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1c57,"Examples/Constrained Resizing window",GImGuiDemoMarkerCallbackUserData);
      }
      local_148.x = 0.0;
      local_148.y = 0.0;
      bVar26 = Button("200x200",&local_148);
      if (bVar26) {
        local_148.x = 200.0;
        local_148.y = 200.0;
        SetWindowSize(&local_148,0);
      }
      SameLine(0.0,-1.0);
      local_148.x = 0.0;
      local_148.y = 0.0;
      bVar26 = Button("500x500",&local_148);
      if (bVar26) {
        local_148.x = 500.0;
        local_148.y = 500.0;
        SetWindowSize(&local_148,0);
      }
      SameLine(0.0,-1.0);
      local_148.x = 0.0;
      local_148.y = 0.0;
      bVar26 = Button("800x200",&local_148);
      if (bVar26) {
        local_148.x = 800.0;
        local_148.y = 200.0;
        SetWindowSize(&local_148,0);
      }
      SetNextItemWidth(200.0);
      Combo("Constraint",&ShowExampleAppConstrainedResize(bool*)::type,(char **)local_d8,7,-1);
      SetNextItemWidth(200.0);
      DragInt("Lines",&ShowExampleAppConstrainedResize(bool*)::display_lines,0.2,1,100,"%d",0);
      Checkbox("Auto-resize",(bool *)&ShowExampleAppConstrainedResize(bool*)::auto_resize);
      if (0 < ShowExampleAppConstrainedResize(bool*)::display_lines) {
        uVar72 = 0;
        iVar43 = 0;
        do {
          Text("%*sHello, sailor! Making this line long enough for the example.",uVar72,"");
          iVar43 = iVar43 + 1;
          uVar72 = (ulong)((int)uVar72 + 4);
        } while (iVar43 < ShowExampleAppConstrainedResize(bool*)::display_lines);
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_simple_overlay == true) {
    pIVar32 = GetIO();
    if (ShowExampleAppSimpleOverlay(bool*)::corner == 0xffffffff) {
      flags = 0xc116b;
    }
    else {
      pIVar33 = GetMainViewport();
      uVar39 = -(uint)((ShowExampleAppSimpleOverlay(bool*)::corner & 1) == 0);
      uVar74 = -(uint)((ShowExampleAppSimpleOverlay(bool*)::corner & 2) == 0);
      fVar52 = (pIVar33->WorkPos).x;
      fVar54 = (pIVar33->WorkPos).y;
      local_d8 = (undefined1  [8])
                 (CONCAT44(~uVar74 & (uint)((pIVar33->WorkSize).y + fVar54 + -10.0),
                           ~uVar39 & (uint)((pIVar33->WorkSize).x + fVar52 + -10.0)) |
                 CONCAT44((uint)(fVar54 + 10.0) & uVar74,(uint)(fVar52 + 10.0) & uVar39));
      uVar72 = ~CONCAT44(uVar74,uVar39) & DAT_0017b750;
      local_148.x = (float)uVar72;
      local_148.y = (float)(uVar72 >> 0x20);
      SetNextWindowPos((ImVec2 *)local_d8,1,&local_148);
      flags = 0xc116f;
    }
    SetNextWindowBgAlpha(0.35);
    bVar26 = Begin("Example: Simple overlay",&ShowDemoWindow::show_app_simple_overlay,flags);
    if (bVar26) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1c82,"Examples/Simple Overlay",GImGuiDemoMarkerCallbackUserData);
      }
      Text("Simple overlay\nin the corner of the screen.\n(right-click to change position)");
      Separator();
      bVar26 = IsMousePosValid((ImVec2 *)0x0);
      if (bVar26) {
        Text("Mouse Position: (%.1f,%.1f)",(double)(pIVar32->MousePos).x);
      }
      else {
        Text("Mouse Position: <invalid>");
      }
      bVar26 = BeginPopupContextWindow((char *)0x0,1);
      if (bVar26) {
        bVar26 = MenuItem("Custom",(char *)0x0,
                          ShowExampleAppSimpleOverlay(bool*)::corner == 0xffffffff,true);
        uVar39 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar26) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0xffffffff;
        }
        bVar26 = MenuItem("Top-left",(char *)0x0,!bVar26 && uVar39 == 0,true);
        uVar39 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar26) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0;
        }
        bVar26 = MenuItem("Top-right",(char *)0x0,!bVar26 && uVar39 == 1,true);
        uVar39 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar26) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 1;
        }
        bVar26 = MenuItem("Bottom-left",(char *)0x0,!bVar26 && uVar39 == 2,true);
        uVar39 = ShowExampleAppSimpleOverlay(bool*)::corner;
        if (bVar26) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 2;
        }
        bVar26 = MenuItem("Bottom-right",(char *)0x0,!bVar26 && uVar39 == 3,true);
        if (bVar26) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 3;
        }
        bVar26 = MenuItem("Close",(char *)0x0,false,true);
        if (bVar26) {
          ShowDemoWindow::show_app_simple_overlay = false;
        }
        EndPopup();
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_fullscreen == true) {
    pIVar33 = GetMainViewport();
    local_d8._0_4_ = 0.0;
    local_d8._4_4_ = 0.0;
    SetNextWindowPos(&pIVar33->Pos + (ulong)ShowExampleAppFullscreen(bool*)::use_work_area * 2,0,
                     (ImVec2 *)local_d8);
    SetNextWindowSize(&pIVar33->Size + (ulong)ShowExampleAppFullscreen(bool*)::use_work_area * 2,0);
    bVar26 = Begin("Example: Fullscreen window",&ShowDemoWindow::show_app_fullscreen,
                   ShowExampleAppFullscreen(bool*)::flags);
    if (bVar26) {
      Checkbox("Use work area instead of main area",
               (bool *)&ShowExampleAppFullscreen(bool*)::use_work_area);
      SameLine(0.0,-1.0);
      HelpMarker(
                "Main Area = entire viewport,\nWork Area = entire viewport minus sections used by the main menu bars, task bars etc.\n\nEnable the main-menu bar in Examples menu to see the difference."
                );
      CheckboxFlags("ImGuiWindowFlags_NoBackground",&ShowExampleAppFullscreen(bool*)::flags,0x80);
      CheckboxFlags("ImGuiWindowFlags_NoDecoration",&ShowExampleAppFullscreen(bool*)::flags,0x2b);
      Indent(0.0);
      CheckboxFlags("ImGuiWindowFlags_NoTitleBar",&ShowExampleAppFullscreen(bool*)::flags,1);
      CheckboxFlags("ImGuiWindowFlags_NoCollapse",&ShowExampleAppFullscreen(bool*)::flags,0x20);
      CheckboxFlags("ImGuiWindowFlags_NoScrollbar",&ShowExampleAppFullscreen(bool*)::flags,8);
      Unindent(0.0);
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      bVar26 = Button("Close this window",(ImVec2 *)local_d8);
      if (bVar26) {
        ShowDemoWindow::show_app_fullscreen = false;
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_window_titles == true) {
    pIVar33 = GetMainViewport();
    local_128._0_4_ = (pIVar33->Pos).x + 100.0;
    fVar52 = (pIVar33->Pos).y;
    local_128._4_4_ = fVar52 + 100.0;
    uStack_120 = 0;
    local_d8._4_4_ = fVar52 + 100.0;
    local_d8._0_4_ = local_128._0_4_;
    local_148.x = 0.0;
    local_148.y = 0.0;
    SetNextWindowPos((ImVec2 *)local_d8,4,&local_148);
    Begin("Same title as another window##1",(bool *)0x0,0);
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x1ccd,"Examples/Manipulating window titles",GImGuiDemoMarkerCallbackUserData);
    }
    Text("This is window 1.\nMy title is the same as window 2, but my identifier is unique.");
    End();
    local_d8._4_4_ = fVar52 + 200.0;
    local_d8._0_4_ = local_128._0_4_;
    local_148.x = 0.0;
    local_148.y = 0.0;
    SetNextWindowPos((ImVec2 *)local_d8,4,&local_148);
    Begin("Same title as another window##2",(bool *)0x0,0);
    Text("This is window 2.\nMy title is the same as window 1, but my identifier is unique.");
    End();
    dVar55 = GetTime();
    cVar38 = "|/-\\"[(int)(dVar55 * 4.0) & 3];
    GetFrameCount();
    sprintf(local_d8,"Animated title %c %d###AnimatedTitle",(ulong)(uint)(int)cVar38);
    local_148.y = fVar52 + 300.0;
    local_148.x = local_128._0_4_;
    local_110.x = 0.0;
    local_110.y = 0.0;
    SetNextWindowPos(&local_148,4,&local_110);
    Begin(local_d8,(bool *)0x0,0);
    Text("This window has a changing title.");
    End();
  }
  if (ShowDemoWindow::show_app_custom_rendering != true) goto LAB_0013c6dd;
  bVar26 = Begin("Example: Custom rendering",&ShowDemoWindow::show_app_custom_rendering,0);
  if (bVar26) {
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x1ceb,"Examples/Custom Rendering",GImGuiDemoMarkerCallbackUserData);
    }
    bVar26 = BeginTabBar("##TabBar",0);
    if (bVar26) {
      bVar26 = BeginTabItem("Primitives",(bool *)0x0,0);
      if (bVar26) {
        local_58 = p_open;
        fVar52 = GetFontSize();
        PushItemWidth(fVar52 * -15.0);
        pIVar34 = GetWindowDrawList();
        Text("Gradients");
        fVar52 = CalcItemWidth();
        local_128._0_4_ = GetFrameHeight();
        local_128._4_4_ = extraout_XMM0_Db;
        uStack_120._0_4_ = extraout_XMM0_Dc;
        uStack_120._4_4_ = extraout_XMM0_Dd;
        local_110.y = (float)local_128._0_4_;
        local_110.x = fVar52;
        local_d8 = (undefined1  [8])GetCursorScreenPos();
        local_148.x = fVar52 + local_d8._0_4_;
        local_148.y = (float)local_128._0_4_ + local_d8._4_4_;
        IVar29 = GetColorU32(0xff000000);
        IVar30 = GetColorU32(0xffffffff);
        ImDrawList::AddRectFilledMultiColor
                  (pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,IVar30,IVar30,IVar29);
        InvisibleButton("##gradient1",&local_110,0);
        local_d8 = (undefined1  [8])GetCursorScreenPos();
        local_148.x = local_110.x + local_d8._0_4_;
        local_148.y = local_110.y + local_d8._4_4_;
        IVar29 = GetColorU32(0xff00ff00);
        IVar30 = GetColorU32(0xff0000ff);
        ImDrawList::AddRectFilledMultiColor
                  (pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,IVar30,IVar30,IVar29);
        InvisibleButton("##gradient2",&local_110,0);
        Text("All primitives");
        DragFloat("Size",&ShowExampleAppCustomRendering(bool*)::sz,0.2,2.0,100.0,"%.0f",0);
        DragFloat("Thickness",&ShowExampleAppCustomRendering(bool*)::thickness,0.05,1.0,8.0,"%.02f",
                  0);
        SliderInt("N-gon sides",&ShowExampleAppCustomRendering(bool*)::ngon_sides,3,0xc,"%d",0);
        Checkbox("##circlesegmentoverride",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::circle_segments_override);
        pIVar35 = GetStyle();
        SameLine(0.0,(pIVar35->ItemInnerSpacing).x);
        bVar26 = SliderInt("Circle segments override",
                           &ShowExampleAppCustomRendering(bool*)::circle_segments_override_v,3,0x28,
                           "%d",0);
        ShowExampleAppCustomRendering(bool*)::circle_segments_override =
             ShowExampleAppCustomRendering(bool*)::circle_segments_override | bVar26;
        Checkbox("##curvessegmentoverride",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::curve_segments_override);
        pIVar35 = GetStyle();
        SameLine(0.0,(pIVar35->ItemInnerSpacing).x);
        bVar26 = SliderInt("Curves segments override",
                           &ShowExampleAppCustomRendering(bool*)::curve_segments_override_v,3,0x28,
                           "%d",0);
        ShowExampleAppCustomRendering(bool*)::curve_segments_override =
             ShowExampleAppCustomRendering(bool*)::curve_segments_override | bVar26;
        ColorEdit4("Color",(float *)ShowExampleAppCustomRendering(bool*)::colf,0);
        IVar56 = GetCursorScreenPos();
        local_d8 = (undefined1  [8])ShowExampleAppCustomRendering(bool*)::colf._0_8_;
        IStack_d0.x = (float)ShowExampleAppCustomRendering(bool*)::colf._8_4_;
        IStack_d0.y = (float)ShowExampleAppCustomRendering(bool*)::colf._12_4_;
        IVar29 = ColorConvertFloat4ToU32((ImVec4 *)local_d8);
        local_dc = 0;
        if (ShowExampleAppCustomRendering(bool*)::circle_segments_override != 0) {
          local_dc = ShowExampleAppCustomRendering(bool*)::circle_segments_override_v;
        }
        iVar43 = 0;
        if (ShowExampleAppCustomRendering(bool*)::curve_segments_override != 0) {
          iVar43 = ShowExampleAppCustomRendering(bool*)::curve_segments_override_v;
        }
        local_4c = ShowExampleAppCustomRendering(bool*)::sz / 5.0;
        local_158 = IVar56.x;
        fStack_154 = IVar56.y;
        uStack_14c = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
        local_48.x = local_158 + 4.0;
        local_48.y = fStack_154;
        uStack_40._0_4_ = (undefined4)extraout_XMM0_Qb;
        uStack_40._4_4_ = uStack_14c;
        fVar52 = fStack_154 + 4.0;
        bVar26 = true;
        do {
          bVar27 = bVar26;
          fVar54 = 1.0;
          if (!bVar27) {
            fVar54 = ShowExampleAppCustomRendering(bool*)::thickness;
          }
          local_128._0_4_ = fVar54;
          fVar53 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
          local_d8._0_4_ = fVar53 + local_48.x;
          local_d8._4_4_ = fVar53 + fVar52;
          ImDrawList::AddNgon(pIVar34,(ImVec2 *)local_d8,fVar53,IVar29,
                              ShowExampleAppCustomRendering(bool*)::ngon_sides,fVar54);
          fVar53 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_48.x;
          _local_108 = ZEXT416((uint)fVar53);
          fVar54 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
          local_d8._0_4_ = fVar54 + fVar53;
          local_d8._4_4_ = fVar54 + fVar52;
          ImDrawList::AddCircle
                    (pIVar34,(ImVec2 *)local_d8,fVar54,IVar29,local_dc,(float)local_128._0_4_);
          local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_;
          _local_108 = ZEXT416((uint)local_d8._0_4_);
          local_d8._4_4_ = fVar52;
          local_148.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_148.y = fVar52 + ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddRect(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,0.0,0,
                              (float)local_128._0_4_);
          local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_;
          _local_108 = ZEXT416((uint)local_d8._0_4_);
          local_148.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_148.y = fVar52 + ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddRect(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,local_4c,0,
                              (float)local_128._0_4_);
          local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_;
          _local_108 = ZEXT416((uint)local_d8._0_4_);
          local_148.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_148.y = fVar52 + ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddRect(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,local_4c,0x90,
                              (float)local_128._0_4_);
          local_108._0_4_ = (float)local_108._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + 10.0
          ;
          local_148.y = ShowExampleAppCustomRendering(bool*)::sz + fVar52 + -0.5;
          local_108._4_4_ = local_148.y;
          uStack_100._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 0.0 + 0.0;
          uStack_100._4_4_ = ShowExampleAppCustomRendering(bool*)::sz + fStack_154 + 0.0;
          local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + (float)local_108._0_4_;
          local_148.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_108._0_4_;
          local_e8.y = local_148.y;
          local_e8.x = (float)local_108._0_4_;
          ImDrawList::AddTriangle
                    (pIVar34,(ImVec2 *)local_d8,&local_148,&local_e8,IVar29,(float)local_128._0_4_);
          local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_;
          _local_108 = ZEXT416((uint)local_d8._0_4_);
          local_148.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_d8._0_4_;
          local_148.y = fVar52;
          ImDrawList::AddLine(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,(float)local_128._0_4_);
          local_148.x = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_;
          local_148.y = ShowExampleAppCustomRendering(bool*)::sz + fVar52;
          uStack_100._0_4_ = (float)local_108._4_4_ + 0.0;
          local_108._4_4_ = local_148.y;
          local_108._0_4_ = local_148.x;
          uStack_100._4_4_ = fStack_154 + 0.0;
          local_d8._0_4_ = local_148.x;
          ImDrawList::AddLine(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,(float)local_128._0_4_);
          local_108._0_4_ = (float)local_108._0_4_ + 10.0;
          local_d8._0_4_ = local_108._0_4_;
          local_148.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_108._0_4_;
          local_148.y = ShowExampleAppCustomRendering(bool*)::sz + fVar52;
          ImDrawList::AddLine(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,(float)local_128._0_4_);
          local_148.x = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_;
          _local_108 = ZEXT416((uint)local_148.x);
          local_140.y = ShowExampleAppCustomRendering(bool*)::sz * -0.4 + fVar52;
          local_138[0].x = local_148.x + ShowExampleAppCustomRendering(bool*)::sz;
          local_138[0].y = fVar52 + ShowExampleAppCustomRendering(bool*)::sz;
          local_148.y = ShowExampleAppCustomRendering(bool*)::sz * 0.6 + fVar52;
          local_140.x = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + local_148.x;
          ImDrawList::AddBezierQuadratic
                    (pIVar34,&local_148,&local_140,local_138,IVar29,(float)local_128._0_4_,iVar43);
          local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_;
          IStack_d0.y = ShowExampleAppCustomRendering(bool*)::sz * 0.3 + fVar52;
          IStack_d0.x = ShowExampleAppCustomRendering(bool*)::sz * 1.3 + (float)local_d8._0_4_;
          local_c8.y = -ShowExampleAppCustomRendering(bool*)::sz * 0.3 +
                       fVar52 + ShowExampleAppCustomRendering(bool*)::sz;
          local_c8.x = -ShowExampleAppCustomRendering(bool*)::sz * 1.3 +
                       ShowExampleAppCustomRendering(bool*)::sz + (float)local_d8._0_4_;
          IStack_c0.y = fVar52 + ShowExampleAppCustomRendering(bool*)::sz;
          IStack_c0.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_d8._0_4_;
          ImDrawList::AddBezierCubic
                    (pIVar34,(ImVec2 *)local_d8,&IStack_d0,&local_c8,&IStack_c0,IVar29,
                     (float)local_128._0_4_,iVar43);
          fVar52 = fVar52 + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
          bVar26 = false;
        } while (bVar27);
        fVar54 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
        local_d8._0_4_ = fVar54 + local_48.x;
        local_d8._4_4_ = fVar54 + fVar52;
        ImDrawList::AddNgonFilled
                  (pIVar34,(ImVec2 *)local_d8,fVar54,IVar29,
                   ShowExampleAppCustomRendering(bool*)::ngon_sides);
        local_48.x = local_48.x + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
        fVar54 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
        local_d8._0_4_ = fVar54 + local_48.x;
        local_d8._4_4_ = fVar54 + fVar52;
        ImDrawList::AddCircleFilled(pIVar34,(ImVec2 *)local_d8,fVar54,IVar29,local_dc);
        local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_48.x;
        _local_128 = ZEXT416((uint)local_d8._0_4_);
        local_d8._4_4_ = fVar52;
        local_148.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
        local_148.y = fVar52 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRectFilled(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,0.0,0);
        local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
        _local_128 = ZEXT416((uint)local_d8._0_4_);
        local_148.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
        local_148.y = fVar52 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRectFilled(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,10.0,0);
        local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
        _local_128 = ZEXT416((uint)local_d8._0_4_);
        local_148.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
        local_148.y = fVar52 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRectFilled(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,10.0,0x90);
        local_128._0_4_ = (float)local_128._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
        local_148.y = ShowExampleAppCustomRendering(bool*)::sz + fVar52 + -0.5;
        local_128._4_4_ = local_148.y;
        uStack_120._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 0.0 + 0.0;
        uStack_120._4_4_ = ShowExampleAppCustomRendering(bool*)::sz + fStack_154 + 0.0;
        local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + (float)local_128._0_4_;
        local_148.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_128._0_4_;
        local_e8.y = local_148.y;
        local_e8.x = (float)local_128._0_4_;
        ImDrawList::AddTriangleFilled(pIVar34,(ImVec2 *)local_d8,&local_148,&local_e8,IVar29);
        local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
        _local_128 = ZEXT416((uint)local_d8._0_4_);
        local_148.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
        local_148.y = ShowExampleAppCustomRendering(bool*)::thickness + fVar52;
        ImDrawList::AddRectFilled(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,0.0,0);
        local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
        _local_128 = ZEXT416((uint)local_d8._0_4_);
        local_148.x = ShowExampleAppCustomRendering(bool*)::thickness + (float)local_d8._0_4_;
        local_148.y = ShowExampleAppCustomRendering(bool*)::sz + fVar52;
        ImDrawList::AddRectFilled(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,0.0,0);
        local_128._0_4_ = (float)local_128._0_4_ + 20.0;
        local_d8._0_4_ = local_128._0_4_;
        local_148.x = (float)local_128._0_4_ + 1.0;
        local_148.y = fVar52 + 1.0;
        ImDrawList::AddRectFilled(pIVar34,(ImVec2 *)local_d8,&local_148,IVar29,0.0,0);
        local_d8._0_4_ = (float)local_128._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
        local_148.x = (float)local_128._0_4_ + ShowExampleAppCustomRendering(bool*)::sz +
                      ShowExampleAppCustomRendering(bool*)::sz;
        local_148.y = fVar52 + ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRectFilledMultiColor
                  (pIVar34,(ImVec2 *)local_d8,&local_148,0xff000000,0xff0000ff,0xff00ffff,0xff00ff00
                  );
        local_d8._0_4_ = (ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 10.2;
        local_d8._4_4_ = (ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 3.0;
        Dummy((ImVec2 *)local_d8);
        PopItemWidth();
        EndTabItem();
        p_open = local_58;
      }
      bVar26 = BeginTabItem("Canvas",(bool *)0x0,0);
      if (bVar26) {
        if (ShowExampleAppCustomRendering(bool*)::points == '\0') {
          ShowDemoWindow();
        }
        Checkbox("Enable grid",(bool *)&ShowExampleAppCustomRendering(bool*)::opt_enable_grid);
        Checkbox("Enable context menu",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu);
        Text("Mouse Left: drag to add lines,\nMouse Right: drag to scroll, click for context menu.")
        ;
        local_d8 = (undefined1  [8])GetCursorScreenPos();
        IVar56 = GetContentRegionAvail();
        local_148.x = IVar56.x;
        local_148.y = IVar56.y;
        if (local_148.x < 50.0) {
          local_148.x = 50.0;
          IVar56.x = 50.0;
          IVar56.y = 0.0;
        }
        if (local_148.y < 50.0) {
          local_148.y = 50.0;
        }
        local_110.x = local_d8._0_4_ + IVar56.x;
        local_110.y = local_d8._4_4_ + local_148.y;
        pIVar32 = GetIO();
        pIVar34 = GetWindowDrawList();
        ImDrawList::AddRectFilled(pIVar34,(ImVec2 *)local_d8,&local_110,0xff323232,0.0,0);
        ImDrawList::AddRect(pIVar34,(ImVec2 *)local_d8,&local_110,0xffffffff,0.0,0,1.0);
        InvisibleButton("canvas",&local_148,3);
        bVar26 = IsItemHovered(0);
        bVar27 = IsItemActive();
        fVar52 = _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0 + local_d8._0_4_;
        fVar54 = _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1 + local_d8._4_4_;
        local_e8.x = (pIVar32->MousePos).x - fVar52;
        local_e8.y = (pIVar32->MousePos).y - fVar54;
        if (bVar26) {
          if (ShowExampleAppCustomRendering(bool*)::adding_line == '\0') {
            bVar26 = IsMouseClicked(0,false);
            if (!bVar26) goto LAB_0013c188;
            ImVector<ImVec2>::push_back
                      ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_e8);
            ImVector<ImVec2>::push_back
                      ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_e8);
            ShowExampleAppCustomRendering(bool*)::adding_line = '\x01';
          }
LAB_0013c191:
          *(ImVec2 *)
           ((long)DAT_001b5390 + (long)(int)ShowExampleAppCustomRendering(bool*)::points * 8 + -8) =
               local_e8;
          bVar26 = IsMouseDown(0);
          if (!bVar26) {
            ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
          }
        }
        else {
LAB_0013c188:
          if (ShowExampleAppCustomRendering(bool*)::adding_line == '\x01') goto LAB_0013c191;
        }
        if (bVar27) {
          if (ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu == '\0') {
            fVar53 = 0.0;
          }
          else {
            fVar53 = -1.0;
          }
          bVar26 = IsMouseDragging(1,fVar53);
          if (bVar26) {
            _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0 =
                 (pIVar32->MouseDelta).x + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0;
            _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1 =
                 (pIVar32->MouseDelta).y + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1;
          }
        }
        IVar56 = GetMouseDragDelta(1,-1.0);
        if ((((ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu == '\x01') &&
             (IVar56.x == 0.0)) && (IVar56.y == 0.0)) && (!NAN(IVar56.y))) {
          OpenPopupOnItemClick("context",1);
        }
        bVar26 = BeginPopup("context",0);
        if (bVar26) {
          uVar39 = ShowExampleAppCustomRendering(bool*)::points;
          if (ShowExampleAppCustomRendering(bool*)::adding_line == '\x01') {
            uVar39 = ShowExampleAppCustomRendering(bool*)::points - 2;
            if (DAT_001b538c < (int)uVar39) {
              if (DAT_001b538c == 0) {
                uVar74 = 8;
              }
              else {
                uVar74 = DAT_001b538c / 2 + DAT_001b538c;
              }
              if ((int)uVar74 <= (int)uVar39) {
                uVar74 = uVar39;
              }
              pvVar36 = MemAlloc((long)(int)uVar74 << 3);
              if (DAT_001b5390 != (void *)0x0) {
                memcpy(pvVar36,DAT_001b5390,
                       (long)(int)ShowExampleAppCustomRendering(bool*)::points << 3);
                MemFree(DAT_001b5390);
              }
              _points = (ulong)uVar74 << 0x20;
              DAT_001b5390 = pvVar36;
            }
            _points = CONCAT44(DAT_001b538c,uVar39);
          }
          ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
          bVar26 = MenuItem("Remove one",(char *)0x0,false,0 < (int)uVar39);
          uVar39 = ShowExampleAppCustomRendering(bool*)::points;
          if (bVar26) {
            uVar39 = ShowExampleAppCustomRendering(bool*)::points - 2;
            if (DAT_001b538c < (int)uVar39) {
              if (DAT_001b538c == 0) {
                uVar74 = 8;
              }
              else {
                uVar74 = DAT_001b538c / 2 + DAT_001b538c;
              }
              if ((int)uVar74 <= (int)uVar39) {
                uVar74 = uVar39;
              }
              pvVar36 = MemAlloc((long)(int)uVar74 << 3);
              if (DAT_001b5390 != (void *)0x0) {
                memcpy(pvVar36,DAT_001b5390,
                       (long)(int)ShowExampleAppCustomRendering(bool*)::points << 3);
                MemFree(DAT_001b5390);
              }
              _points = (ulong)uVar74 << 0x20;
              DAT_001b5390 = pvVar36;
            }
            _points = CONCAT44(DAT_001b538c,uVar39);
          }
          bVar26 = MenuItem("Remove all",(char *)0x0,false,0 < (int)uVar39);
          if ((bVar26) && (DAT_001b5390 != (void *)0x0)) {
            _points = 0;
            MemFree(DAT_001b5390);
            DAT_001b5390 = (void *)0x0;
          }
          EndPopup();
        }
        ImDrawList::PushClipRect(pIVar34,(ImVec2)local_d8,local_110,true);
        if (ShowExampleAppCustomRendering(bool*)::opt_enable_grid == '\x01') {
          fVar53 = fmodf(_ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0,64.0);
          if (fVar53 < local_148.x) {
            do {
              local_128._0_4_ = fVar53;
              local_f8.y = (float)local_d8._4_4_;
              local_f8.x = (float)local_d8._0_4_ + fVar53;
              local_f0.y = local_110.y;
              local_f0.x = (float)local_d8._0_4_ + fVar53;
              ImDrawList::AddLine(pIVar34,&local_f8,&local_f0,0x28c8c8c8,1.0);
              fVar53 = (float)local_128._0_4_ + 64.0;
            } while (fVar53 < local_148.x);
          }
          fVar53 = fmodf(_ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1,64.0);
          if (fVar53 < local_148.y) {
            do {
              local_128._0_4_ = fVar53;
              local_f8.y = (float)local_d8._4_4_ + fVar53;
              local_f8.x = local_d8._0_4_;
              local_f0.y = (float)local_d8._4_4_ + fVar53;
              local_f0.x = local_110.x;
              ImDrawList::AddLine(pIVar34,&local_f8,&local_f0,0x28c8c8c8,1.0);
              fVar53 = (float)local_128._0_4_ + 64.0;
            } while (fVar53 < local_148.y);
          }
        }
        if (0 < (int)ShowExampleAppCustomRendering(bool*)::points) {
          lVar45 = 0;
          do {
            uVar1 = *(undefined8 *)((long)DAT_001b5390 + lVar45 * 8);
            local_f8.x = (float)uVar1 + fVar52;
            local_f8.y = (float)((ulong)uVar1 >> 0x20) + fVar54;
            uVar1 = *(undefined8 *)((long)DAT_001b5390 + lVar45 * 8 + 8);
            local_f0.x = (float)uVar1 + fVar52;
            local_f0.y = (float)((ulong)uVar1 >> 0x20) + fVar54;
            ImDrawList::AddLine(pIVar34,&local_f8,&local_f0,0xff00ffff,2.0);
            lVar45 = lVar45 + 2;
          } while ((int)lVar45 < (int)ShowExampleAppCustomRendering(bool*)::points);
        }
        ImDrawList::PopClipRect(pIVar34);
        EndTabItem();
      }
      bVar26 = BeginTabItem("BG/FG draw lists",(bool *)0x0,0);
      if (bVar26) {
        Checkbox("Draw in Background draw list",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::draw_bg);
        SameLine(0.0,-1.0);
        HelpMarker("The Background draw list will be rendered below every Dear ImGui windows.");
        Checkbox("Draw in Foreground draw list",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::draw_fg);
        SameLine(0.0,-1.0);
        HelpMarker("The Foreground draw list will be rendered over every Dear ImGui windows.");
        IVar56 = GetWindowPos();
        uStack_120 = extraout_XMM0_Qb_00;
        local_128._0_4_ = IVar56.x;
        local_128._4_4_ = IVar56.y;
        IVar56 = GetWindowSize();
        local_d8._0_4_ = IVar56.x * 0.5 + (float)local_128._0_4_;
        local_d8._4_4_ = IVar56.y * 0.5 + (float)local_128._4_4_;
        if (ShowExampleAppCustomRendering(bool*)::draw_bg == '\x01') {
          pIVar34 = GetBackgroundDrawList();
          ImDrawList::AddCircle(pIVar34,(ImVec2 *)local_d8,IVar56.x * 0.6,0xc80000ff,0,14.0);
        }
        if (ShowExampleAppCustomRendering(bool*)::draw_fg == '\x01') {
          pIVar34 = GetForegroundDrawList();
          ImDrawList::AddCircle(pIVar34,(ImVec2 *)local_d8,IVar56.y * 0.6,0xc800ff00,0,10.0);
        }
        EndTabItem();
      }
      EndTabBar();
    }
  }
  End();
LAB_0013c6dd:
  if (ShowDemoWindow::show_app_metrics == true) {
    ShowMetricsWindow(&ShowDemoWindow::show_app_metrics);
  }
  if (ShowDemoWindow::show_app_stack_tool == true) {
    ShowStackToolWindow(&ShowDemoWindow::show_app_stack_tool);
  }
  if (ShowDemoWindow::show_app_about == true) {
    ShowAboutWindow(&ShowDemoWindow::show_app_about);
  }
  if (ShowDemoWindow::show_app_style_editor == true) {
    Begin("Dear ImGui Style Editor",&ShowDemoWindow::show_app_style_editor,0);
    ShowStyleEditor((ImGuiStyle *)0x0);
    End();
  }
  uVar39 = ShowDemoWindow::no_titlebar + 8;
  if (ShowDemoWindow::no_scrollbar == false) {
    uVar39 = (uint)ShowDemoWindow::no_titlebar;
  }
  uVar74 = uVar39 + 0x400;
  if (ShowDemoWindow::no_menu != false) {
    uVar74 = uVar39;
  }
  uVar39 = uVar74 + 4;
  if (ShowDemoWindow::no_move == false) {
    uVar39 = uVar74;
  }
  uVar74 = uVar39 | 2;
  if (ShowDemoWindow::no_resize == false) {
    uVar74 = uVar39;
  }
  uVar39 = uVar74 | 0x20;
  if (ShowDemoWindow::no_collapse == false) {
    uVar39 = uVar74;
  }
  uVar74 = uVar39 | 0xc0000;
  if (ShowDemoWindow::no_nav == false) {
    uVar74 = uVar39;
  }
  uVar39 = uVar74 | 0x80;
  if (ShowDemoWindow::no_background == false) {
    uVar39 = uVar74;
  }
  uVar74 = uVar39 | 0x2000;
  if (ShowDemoWindow::no_bring_to_front == false) {
    uVar74 = uVar39;
  }
  uVar39 = uVar74 | 0x100000;
  if (ShowDemoWindow::unsaved_document == false) {
    uVar39 = uVar74;
  }
  if (ShowDemoWindow::no_close != false) {
    p_open = (bool *)0x0;
  }
  pIVar33 = GetMainViewport();
  local_d8._0_4_ = (pIVar33->WorkPos).x + 650.0;
  local_d8._4_4_ = (pIVar33->WorkPos).y + 20.0;
  local_148.x = 0.0;
  local_148.y = 0.0;
  SetNextWindowPos((ImVec2 *)local_d8,4,&local_148);
  local_d8._0_4_ = 550.0;
  local_d8._4_4_ = 680.0;
  SetNextWindowSize((ImVec2 *)local_d8,4);
  bVar26 = Begin("Dear ImGui Demo",p_open,uVar39);
  if (bVar26) {
    fVar52 = GetFontSize();
    PushItemWidth(fVar52 * -12.0);
    bVar26 = BeginMenuBar();
    if (bVar26) {
      bVar26 = BeginMenu("Menu",true);
      if (bVar26) {
        if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
          (*GImGuiDemoMarkerCallback)
                    ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                     ,0x174,"Menu/File",GImGuiDemoMarkerCallbackUserData);
        }
        ShowExampleMenuFile();
        EndMenu();
      }
      bVar26 = BeginMenu("Examples",true);
      if (bVar26) {
        if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
          (*GImGuiDemoMarkerCallback)
                    ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                     ,0x17a,"Menu/Examples",GImGuiDemoMarkerCallbackUserData);
        }
        MenuItem("Main menu bar",(char *)0x0,&ShowDemoWindow::show_app_main_menu_bar,true);
        MenuItem("Console",(char *)0x0,&ShowDemoWindow::show_app_console,true);
        MenuItem("Log",(char *)0x0,&ShowDemoWindow::show_app_log,true);
        MenuItem("Simple layout",(char *)0x0,&ShowDemoWindow::show_app_layout,true);
        MenuItem("Property editor",(char *)0x0,&ShowDemoWindow::show_app_property_editor,true);
        MenuItem("Long text display",(char *)0x0,&ShowDemoWindow::show_app_long_text,true);
        MenuItem("Auto-resizing window",(char *)0x0,&ShowDemoWindow::show_app_auto_resize,true);
        MenuItem("Constrained-resizing window",(char *)0x0,
                 &ShowDemoWindow::show_app_constrained_resize,true);
        MenuItem("Simple overlay",(char *)0x0,&ShowDemoWindow::show_app_simple_overlay,true);
        MenuItem("Fullscreen window",(char *)0x0,&ShowDemoWindow::show_app_fullscreen,true);
        MenuItem("Manipulating window titles",(char *)0x0,&ShowDemoWindow::show_app_window_titles,
                 true);
        MenuItem("Custom rendering",(char *)0x0,&ShowDemoWindow::show_app_custom_rendering,true);
        MenuItem("Documents",(char *)0x0,&ShowDemoWindow::show_app_documents,true);
        EndMenu();
      }
      bVar26 = BeginMenu("Tools",true);
      if (bVar26) {
        if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
          (*GImGuiDemoMarkerCallback)
                    ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                     ,0x18d,"Menu/Tools",GImGuiDemoMarkerCallbackUserData);
        }
        MenuItem("Metrics/Debugger",(char *)0x0,&ShowDemoWindow::show_app_metrics,true);
        MenuItem("Stack Tool",(char *)0x0,&ShowDemoWindow::show_app_stack_tool,true);
        MenuItem("Style Editor",(char *)0x0,&ShowDemoWindow::show_app_style_editor,true);
        MenuItem("About Dear ImGui",(char *)0x0,&ShowDemoWindow::show_app_about,true);
        EndMenu();
      }
      EndMenuBar();
    }
    Text("dear imgui says hello. (%s)");
    Spacing();
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x19c,"Help",GImGuiDemoMarkerCallbackUserData);
    }
    bVar26 = CollapsingHeader("Help",0);
    if (bVar26) {
      Text("ABOUT THIS DEMO:");
      BulletText("Sections below are demonstrating many aspects of the library.");
      BulletText("The \"Examples\" menu above leads to more demo contents.");
      BulletText(
                "The \"Tools\" menu above gives access to: About Box, Style Editor,\nand Metrics/Debugger (general purpose Dear ImGui debugging tool)."
                );
      Separator();
      Text("PROGRAMMER GUIDE:");
      BulletText("See the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
      BulletText("See comments in imgui.cpp.");
      BulletText("See example applications in the examples/ folder.");
      BulletText("Read the FAQ at http://www.dearimgui.org/faq/");
      BulletText("Set \'io.ConfigFlags |= NavEnableKeyboard\' for keyboard controls.");
      BulletText("Set \'io.ConfigFlags |= NavEnableGamepad\' for gamepad controls.");
      Separator();
      Text("USER GUIDE:");
      ShowUserGuide();
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x1b3,"Configuration",GImGuiDemoMarkerCallbackUserData);
    }
    bVar26 = CollapsingHeader("Configuration",0);
    if (bVar26) {
      pIVar32 = GetIO();
      bVar26 = TreeNode("Configuration##2");
      if (bVar26) {
        CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",&pIVar32->ConfigFlags,1);
        SameLine(0.0,-1.0);
        HelpMarker("Enable keyboard controls.");
        CheckboxFlags("io.ConfigFlags: NavEnableGamepad",&pIVar32->ConfigFlags,2);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable gamepad controls. Require backend to set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details."
                  );
        CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos",&pIVar32->ConfigFlags,4);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos."
                  );
        CheckboxFlags("io.ConfigFlags: NoMouse",&pIVar32->ConfigFlags,0x10);
        if ((pIVar32->ConfigFlags & 0x10) != 0) {
          dVar55 = GetTime();
          fVar52 = fmodf((float)dVar55,0.4);
          if (fVar52 < 0.2) {
            SameLine(0.0,-1.0);
            Text("<<PRESS SPACE TO DISABLE>>");
          }
          bVar26 = IsKeyPressed(0x20c,true);
          if (bVar26) {
            *(byte *)&pIVar32->ConfigFlags = (byte)pIVar32->ConfigFlags & 0xef;
          }
        }
        CheckboxFlags("io.ConfigFlags: NoMouseCursorChange",&pIVar32->ConfigFlags,0x20);
        SameLine(0.0,-1.0);
        HelpMarker("Instruct backend to not alter mouse cursor shape and visibility.");
        Checkbox("io.ConfigInputTrickleEventQueue",&pIVar32->ConfigInputTrickleEventQueue);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable input queue trickling: some types of events submitted during the same frame (e.g. button down + up) will be spread over multiple frames, improving interactions with low framerates."
                  );
        Checkbox("io.ConfigInputTextCursorBlink",&pIVar32->ConfigInputTextCursorBlink);
        SameLine(0.0,-1.0);
        HelpMarker("Enable blinking cursor (optional as some users consider it to be distracting).")
        ;
        Checkbox("io.ConfigDragClickToInputText",&pIVar32->ConfigDragClickToInputText);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable turning DragXXX widgets into text input with a simple mouse click-release (without moving)."
                  );
        Checkbox("io.ConfigWindowsResizeFromEdges",&pIVar32->ConfigWindowsResizeFromEdges);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback."
                  );
        Checkbox("io.ConfigWindowsMoveFromTitleBarOnly",&pIVar32->ConfigWindowsMoveFromTitleBarOnly)
        ;
        Checkbox("io.MouseDrawCursor",&pIVar32->MouseDrawCursor);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct Dear ImGui to render a mouse cursor itself. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something)."
                  );
        Text("Also see Style->Rendering for rendering options.");
        TreePop();
        Separator();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1de,"Configuration/Backend Flags",GImGuiDemoMarkerCallbackUserData);
      }
      bVar26 = TreeNode("Backend Flags");
      if (bVar26) {
        HelpMarker(
                  "Those flags are set by the backends (imgui_impl_xxx files) to specify their capabilities.\nHere we expose them as read-only fields to avoid breaking interactions with your backend."
                  );
        local_d8._0_4_ = pIVar32->BackendFlags;
        CheckboxFlags("io.BackendFlags: HasGamepad",(int *)local_d8,1);
        CheckboxFlags("io.BackendFlags: HasMouseCursors",(int *)local_d8,2);
        CheckboxFlags("io.BackendFlags: HasSetMousePos",(int *)local_d8,4);
        CheckboxFlags("io.BackendFlags: RendererHasVtxOffset",(int *)local_d8,8);
        TreePop();
        Separator();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1f0,"Configuration/Style",GImGuiDemoMarkerCallbackUserData);
      }
      bVar26 = TreeNode("Style");
      if (bVar26) {
        HelpMarker(
                  "The same contents can be accessed in \'Tools->Style Editor\' or by calling the ShowStyleEditor() function."
                  );
        ShowStyleEditor((ImGuiStyle *)0x0);
        TreePop();
        Separator();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1f9,"Configuration/Capture, Logging",GImGuiDemoMarkerCallbackUserData);
      }
      bVar26 = TreeNode("Capture/Logging");
      if (bVar26) {
        HelpMarker(
                  "The logging API redirects all text output so you can easily capture the content of a window or a block. Tree nodes can be automatically expanded.\nTry opening any of the contents below in this window and then click one of the \"Log To\" button."
                  );
        LogButtons();
        HelpMarker(
                  "You can also call ImGui::LogText() to output directly to the log without a visual output."
                  );
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Copy \"Hello, world!\" to clipboard",(ImVec2 *)local_d8);
        if (bVar26) {
          LogToClipboard(-1);
          LogText("Hello, world!");
          LogFinish();
        }
        TreePop();
      }
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x20d,"Window options",GImGuiDemoMarkerCallbackUserData);
    }
    bVar26 = CollapsingHeader("Window options",0);
    if (bVar26) {
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      bVar26 = BeginTable("split",3,0,(ImVec2 *)local_d8,0.0);
      if (bVar26) {
        TableNextColumn();
        Checkbox("No titlebar",&ShowDemoWindow::no_titlebar);
        TableNextColumn();
        Checkbox("No scrollbar",&ShowDemoWindow::no_scrollbar);
        TableNextColumn();
        Checkbox("No menu",&ShowDemoWindow::no_menu);
        TableNextColumn();
        Checkbox("No move",&ShowDemoWindow::no_move);
        TableNextColumn();
        Checkbox("No resize",&ShowDemoWindow::no_resize);
        TableNextColumn();
        Checkbox("No collapse",&ShowDemoWindow::no_collapse);
        TableNextColumn();
        Checkbox("No close",&ShowDemoWindow::no_close);
        TableNextColumn();
        Checkbox("No nav",&ShowDemoWindow::no_nav);
        TableNextColumn();
        Checkbox("No background",&ShowDemoWindow::no_background);
        TableNextColumn();
        Checkbox("No bring to front",&ShowDemoWindow::no_bring_to_front);
        TableNextColumn();
        Checkbox("Unsaved document",&ShowDemoWindow::unsaved_document);
        EndTable();
      }
    }
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0xcb8,"Popups",GImGuiDemoMarkerCallbackUserData);
    }
    bVar26 = CollapsingHeader("Popups & Modal windows",0);
    if (bVar26) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0xcce,"Popups/Popups",GImGuiDemoMarkerCallbackUserData);
      }
      bVar26 = TreeNode("Popups");
      if (bVar26) {
        TextWrapped(
                   "When a popup is active, it inhibits interacting with windows that are behind the popup. Clicking outside the popup closes it."
                   );
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Select..",(ImVec2 *)local_d8);
        if (bVar26) {
          OpenPopup("my_select_popup",0);
        }
        SameLine(0.0,-1.0);
        if ((long)ShowDemoWindowPopups()::selected_fish == -1) {
          pcVar46 = "<None>";
        }
        else {
          pcVar46 = (&PTR_anon_var_dwarf_6bd8b_001a9540)[ShowDemoWindowPopups()::selected_fish];
        }
        TextUnformatted(pcVar46,(char *)0x0);
        bVar26 = BeginPopup("my_select_popup",0);
        if (bVar26) {
          lVar45 = 0;
          Text("Aquarium");
          Separator();
          ppuVar51 = &PTR_anon_var_dwarf_6bd8b_001a9540;
          do {
            local_d8._0_4_ = 0.0;
            local_d8._4_4_ = 0.0;
            bVar26 = Selectable(*ppuVar51,false,0,(ImVec2 *)local_d8);
            if (bVar26) {
              ShowDemoWindowPopups()::selected_fish = (int)lVar45;
            }
            lVar45 = lVar45 + 1;
            ppuVar51 = ppuVar51 + 1;
          } while (lVar45 != 5);
          EndPopup();
        }
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Toggle..",(ImVec2 *)local_d8);
        if (bVar26) {
          OpenPopup("my_toggle_popup",0);
        }
        bVar26 = BeginPopup("my_toggle_popup",0);
        if (bVar26) {
          pbVar44 = (bool *)&ShowDemoWindowPopups()::toggles;
          lVar45 = 0;
          do {
            MenuItem(*(char **)((long)&PTR_anon_var_dwarf_6bd8b_001a9540 + lVar45),"",pbVar44,true);
            lVar45 = lVar45 + 8;
            pbVar44 = pbVar44 + 1;
          } while (lVar45 != 0x28);
          bVar26 = BeginMenu("Sub-menu",true);
          if (bVar26) {
            MenuItem("Click me",(char *)0x0,false,true);
            EndMenu();
          }
          Separator();
          Text("Tooltip here");
          bVar26 = IsItemHovered(0);
          if (bVar26) {
            SetTooltip("I am a tooltip over a popup");
          }
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          bVar26 = Button("Stacked Popup",(ImVec2 *)local_d8);
          if (bVar26) {
            OpenPopup("another popup",0);
          }
          bVar26 = BeginPopup("another popup",0);
          if (bVar26) {
            pbVar44 = (bool *)&ShowDemoWindowPopups()::toggles;
            lVar45 = 0;
            do {
              MenuItem(*(char **)((long)&PTR_anon_var_dwarf_6bd8b_001a9540 + lVar45),"",pbVar44,true
                      );
              lVar45 = lVar45 + 8;
              pbVar44 = pbVar44 + 1;
            } while (lVar45 != 0x28);
            bVar26 = BeginMenu("Sub-menu",true);
            if (bVar26) {
              MenuItem("Click me",(char *)0x0,false,true);
              local_d8._0_4_ = 0.0;
              local_d8._4_4_ = 0.0;
              bVar26 = Button("Stacked Popup",(ImVec2 *)local_d8);
              if (bVar26) {
                OpenPopup("another popup",0);
              }
              bVar26 = BeginPopup("another popup",0);
              if (bVar26) {
                Text("I am the last one here.");
                EndPopup();
              }
              EndMenu();
            }
            EndPopup();
          }
          EndPopup();
        }
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("With a menu..",(ImVec2 *)local_d8);
        if (bVar26) {
          OpenPopup("my_file_popup",0);
        }
        bVar26 = BeginPopup("my_file_popup",0x400);
        if (bVar26) {
          bVar26 = BeginMenuBar();
          if (bVar26) {
            bVar26 = BeginMenu("File",true);
            if (bVar26) {
              ShowExampleMenuFile();
              EndMenu();
            }
            bVar26 = BeginMenu("Edit",true);
            if (bVar26) {
              MenuItem("Dummy",(char *)0x0,false,true);
              EndMenu();
            }
            EndMenuBar();
          }
          Text("Hello from popup!");
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          Button("This is a dummy button..",(ImVec2 *)local_d8);
          EndPopup();
        }
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0xd2d,"Popups/Context menus",GImGuiDemoMarkerCallbackUserData);
      }
      bVar26 = TreeNode("Context menus");
      if (bVar26) {
        HelpMarker(
                  "\"Context\" functions are simple helpers to associate a Popup to a given Item or Window identifier."
                  );
        lVar45 = 0;
        do {
          pcVar46 = *(char **)((long)&PTR_anon_var_dwarf_6bedb_001a9570 + lVar45);
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          Selectable(pcVar46,false,0,(ImVec2 *)local_d8);
          bVar26 = BeginPopupContextItem((char *)0x0,1);
          if (bVar26) {
            Text("This a popup for \"%s\"!",pcVar46);
            local_d8._0_4_ = 0.0;
            local_d8._4_4_ = 0.0;
            bVar26 = Button("Close",(ImVec2 *)local_d8);
            if (bVar26) {
              CloseCurrentPopup();
            }
            EndPopup();
          }
          bVar26 = IsItemHovered(0);
          if (bVar26) {
            SetTooltip("Right-click to open popup");
          }
          lVar45 = lVar45 + 8;
        } while (lVar45 != 0x28);
        HelpMarker("Text() elements don\'t have stable identifiers so we need to provide one.");
        Text("Value = %.3f <-- (1) right-click this value",(double)ShowDemoWindowPopups()::value);
        bVar26 = BeginPopupContextItem("my popup",1);
        if (bVar26) {
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          bVar26 = Selectable("Set to zero",false,0,(ImVec2 *)local_d8);
          if (bVar26) {
            ShowDemoWindowPopups()::value = 0.0;
          }
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          bVar26 = Selectable("Set to PI",false,0,(ImVec2 *)local_d8);
          if (bVar26) {
            ShowDemoWindowPopups()::value = 3.1415;
          }
          SetNextItemWidth(-1.1754944e-38);
          DragFloat("##Value",&ShowDemoWindowPopups()::value,0.1,0.0,0.0,"%.3f",0);
          EndPopup();
        }
        Text("(2) Or right-click this text");
        OpenPopupOnItemClick("my popup",1);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("(3) Or click this button",(ImVec2 *)local_d8);
        if (bVar26) {
          OpenPopup("my popup",0);
        }
        HelpMarker(
                  "Showcase using a popup ID linked to item ID, with the item having a changing label + stable ID using the ### operator."
                  );
        sprintf(local_d8,"Button: %s###Button",ShowDemoWindowPopups()::name);
        local_148.x = 0.0;
        local_148.y = 0.0;
        Button(local_d8,&local_148);
        bVar26 = BeginPopupContextItem((char *)0x0,1);
        if (bVar26) {
          Text("Edit name:");
          InputText("##edit",ShowDemoWindowPopups()::name,0x20,0,(ImGuiInputTextCallback)0x0,
                    (void *)0x0);
          local_148.x = 0.0;
          local_148.y = 0.0;
          bVar26 = Button("Close",&local_148);
          if (bVar26) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        SameLine(0.0,-1.0);
        Text("(<-- right-click here)");
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0xd82,"Popups/Modals",GImGuiDemoMarkerCallbackUserData);
      }
      bVar26 = TreeNode("Modals");
      if (bVar26) {
        TextWrapped(
                   "Modal windows are like popups but the user cannot close them by clicking outside."
                   );
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Delete..",(ImVec2 *)local_d8);
        if (bVar26) {
          OpenPopup("Delete?",0);
        }
        pIVar33 = GetMainViewport();
        local_148.x = (float)DAT_0017b740;
        local_148.y = DAT_0017b740._4_4_;
        local_d8._0_4_ = (pIVar33->Size).x * local_148.x + (pIVar33->Pos).x;
        local_d8._4_4_ = (pIVar33->Size).y * local_148.y + (pIVar33->Pos).y;
        SetNextWindowPos((ImVec2 *)local_d8,8,&local_148);
        bVar26 = BeginPopupModal("Delete?",(bool *)0x0,0x40);
        if (bVar26) {
          Text("All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n");
          Separator();
          local_148.x = 0.0;
          local_148.y = 0.0;
          PushStyleVar(0xb,&local_148);
          Checkbox("Don\'t ask me next time",(bool *)&ShowDemoWindowPopups()::dont_ask_me_next_time)
          ;
          PopStyleVar(1);
          local_148.x = 120.0;
          local_148.y = 0.0;
          bVar26 = Button("OK",&local_148);
          if (bVar26) {
            CloseCurrentPopup();
          }
          SetItemDefaultFocus();
          SameLine(0.0,-1.0);
          local_148.x = 120.0;
          local_148.y = 0.0;
          bVar26 = Button("Cancel",&local_148);
          if (bVar26) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        local_148.x = 0.0;
        local_148.y = 0.0;
        bVar26 = Button("Stacked modals..",&local_148);
        if (bVar26) {
          OpenPopup("Stacked 1",0);
        }
        bVar26 = BeginPopupModal("Stacked 1",(bool *)0x0,0x400);
        if (bVar26) {
          bVar26 = BeginMenuBar();
          if (bVar26) {
            bVar26 = BeginMenu("File",true);
            if (bVar26) {
              MenuItem("Some menu item",(char *)0x0,false,true);
              EndMenu();
            }
            EndMenuBar();
          }
          Text(
              "Hello from Stacked The First\nUsing style.Colors[ImGuiCol_ModalWindowDimBg] behind it."
              );
          Combo("Combo",&ShowDemoWindowPopups()::item,"aaaa",-1);
          ColorEdit4("color",(float *)ShowDemoWindowPopups()::color,0);
          local_148.x = 0.0;
          local_148.y = 0.0;
          bVar26 = Button("Add another modal..",&local_148);
          if (bVar26) {
            OpenPopup("Stacked 2",0);
          }
          local_110.x._0_1_ = 1;
          bVar26 = BeginPopupModal("Stacked 2",(bool *)&local_110,0);
          if (bVar26) {
            Text("Hello from Stacked The Second!");
            local_148.x = 0.0;
            local_148.y = 0.0;
            bVar26 = Button("Close",&local_148);
            if (bVar26) {
              CloseCurrentPopup();
            }
            EndPopup();
          }
          local_148.x = 0.0;
          local_148.y = 0.0;
          bVar26 = Button("Close",&local_148);
          if (bVar26) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0xdce,"Popups/Menus inside a regular window",GImGuiDemoMarkerCallbackUserData);
      }
      bVar26 = TreeNode("Menus inside a regular window");
      if (bVar26) {
        TextWrapped(
                   "Below we are testing adding menu items to a regular window. It\'s rather unusual but should work!"
                   );
        Separator();
        PushID("foo");
        MenuItem("Menu item","CTRL+M",false,true);
        bVar26 = BeginMenu("Menu inside a regular window",true);
        if (bVar26) {
          ShowExampleMenuFile();
          EndMenu();
        }
        PopID();
        Separator();
        TreePop();
      }
    }
    ShowDemoWindowTables();
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x160d,"Filtering",GImGuiDemoMarkerCallbackUserData);
    }
    bVar26 = CollapsingHeader("Filtering",0);
    if (bVar26) {
      if ((ShowDemoWindowMisc()::filter == '\0') &&
         (iVar43 = __cxa_guard_acquire(&ShowDemoWindowMisc()::filter), iVar43 != 0)) {
        ImGuiTextFilter::ImGuiTextFilter((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"");
        __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,ShowDemoWindowMisc()::filter,&__dso_handle);
        __cxa_guard_release(&ShowDemoWindowMisc()::filter);
      }
      Text(
          "Filter usage:\n  \"\"         display all lines\n  \"xxx\"      display lines containing \"xxx\"\n  \"xxx,yyy\"  display lines containing \"xxx\" or \"yyy\"\n  \"-xxx\"     hide lines containing \"xxx\""
          );
      ImGuiTextFilter::Draw((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"Filter (inc,-exc)",0.0)
      ;
      lVar45 = 0;
      do {
        bVar26 = ImGuiTextFilter::PassFilter
                           ((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,
                            *(char **)((long)&PTR_anon_var_dwarf_725d3_001a9810 + lVar45),
                            (char *)0x0);
        if (bVar26) {
          BulletText("%s");
        }
        lVar45 = lVar45 + 8;
      } while (lVar45 != 0x40);
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x161f,"Inputs, Navigation & Focus",GImGuiDemoMarkerCallbackUserData);
    }
    bVar26 = CollapsingHeader("Inputs, Navigation & Focus",0);
    if (bVar26) {
      IVar56 = (ImVec2)GetIO();
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1625,"Inputs, Navigation & Focus/Output",GImGuiDemoMarkerCallbackUserData);
      }
      SetNextItemOpen(true,2);
      bVar26 = TreeNode("Output");
      if (bVar26) {
        Text("io.WantCaptureMouse: %d",(ulong)*(bool *)((long)IVar56 + 200));
        Text("io.WantCaptureMouseUnlessPopupClose: %d",(ulong)*(bool *)((long)IVar56 + 0x364c));
        Text("io.WantCaptureKeyboard: %d",(ulong)*(bool *)((long)IVar56 + 0xc9));
        Text("io.WantTextInput: %d",(ulong)*(bool *)((long)IVar56 + 0xca));
        Text("io.WantSetMousePos: %d",(ulong)*(bool *)((long)IVar56 + 0xcb));
        Text("io.NavActive: %d, io.NavVisible: %d",(ulong)*(bool *)((long)IVar56 + 0xcd),
             (ulong)*(bool *)((long)IVar56 + 0xce));
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1633,"Inputs, Navigation & Focus/Mouse State",GImGuiDemoMarkerCallbackUserData
                  );
      }
      bVar26 = TreeNode("Mouse State");
      if (bVar26) {
        bVar26 = IsMousePosValid((ImVec2 *)0x0);
        if (bVar26) {
          Text("Mouse pos: (%g, %g)",(double)((ImVec2 *)((long)IVar56 + 0xd8c))->x,
               (double)*(float *)((long)IVar56 + 0xd90));
        }
        else {
          Text("Mouse pos: <INVALID>");
        }
        Text("Mouse delta: (%g, %g)",(double)((ImVec2 *)((long)IVar56 + 0xe8))->x);
        lVar45 = 0;
        Text("Mouse down:");
        do {
          bVar26 = IsMouseDown((ImGuiMouseButton)lVar45);
          if (bVar26) {
            SameLine(0.0,-1.0);
            Text("b%d (%.02f secs)",(double)((float *)((long)IVar56 + 0x36d8))[lVar45]);
          }
          lVar45 = lVar45 + 1;
        } while (lVar45 != 5);
        Text("Mouse clicked:");
        uVar39 = 0;
        do {
          bVar26 = IsMouseClicked(uVar39,false);
          if (bVar26) {
            SameLine(0.0,-1.0);
            uVar74 = GetMouseClickedCount(uVar39);
            Text("b%d (%d)",(ulong)uVar39,(ulong)uVar74);
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 != 5);
        Text("Mouse released:");
        uVar72 = 0;
        do {
          bVar26 = IsMouseReleased((int)uVar72);
          if (bVar26) {
            SameLine(0.0,-1.0);
            Text("b%d",uVar72);
          }
          uVar39 = (int)uVar72 + 1;
          uVar72 = (ulong)uVar39;
        } while (uVar39 != 5);
        Text("Mouse wheel: %.1f",(double)*(float *)((long)IVar56 + 0xd9c));
        Text("Pen Pressure: %.1f",(double)*(float *)((long)IVar56 + 0x37b4));
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1646,"Inputs, Navigation & Focus/Keyboard, Gamepad & Navigation State",
                   GImGuiDemoMarkerCallbackUserData);
      }
      bVar26 = TreeNode("Keyboard, Gamepad & Navigation State");
      if (bVar26) {
        uVar72 = 0;
        Text("Keys down:");
        do {
          if ((0x1ff < uVar72) || (pIVar32 = GetIO(), pIVar32->KeyMap[uVar72] == -1)) {
            key = (ImGuiKey)uVar72;
            bVar26 = IsKeyDown(key);
            if (bVar26) {
              SameLine(0.0,-1.0);
              pcVar46 = GetKeyName(key);
              pIVar37 = GetKeyData(key);
              Text("\"%s\" %d (%.02f secs)",(double)pIVar37->DownDuration,pcVar46,
                   uVar72 & 0xffffffff);
            }
          }
          uVar72 = uVar72 + 1;
        } while (uVar72 != 0x285);
        Text("Keys pressed:");
        uVar72 = 0;
        do {
          if ((0x1ff < uVar72) || (pIVar32 = GetIO(), pIVar32->KeyMap[uVar72] == -1)) {
            bVar26 = IsKeyPressed((ImGuiKey)uVar72,true);
            if (bVar26) {
              SameLine(0.0,-1.0);
              pcVar46 = GetKeyName((ImGuiKey)uVar72);
              Text("\"%s\" %d",pcVar46,uVar72 & 0xffffffff);
            }
          }
          uVar72 = uVar72 + 1;
        } while (uVar72 != 0x285);
        Text("Keys released:");
        uVar72 = 0;
        do {
          if ((0x1ff < uVar72) || (pIVar32 = GetIO(), pIVar32->KeyMap[uVar72] == -1)) {
            bVar26 = IsKeyReleased((ImGuiKey)uVar72);
            if (bVar26) {
              SameLine(0.0,-1.0);
              pcVar46 = GetKeyName((ImGuiKey)uVar72);
              Text("\"%s\" %d",pcVar46,uVar72 & 0xffffffff);
            }
          }
          uVar72 = uVar72 + 1;
        } while (uVar72 != 0x285);
        pcVar46 = "CTRL ";
        if (*(bool *)((long)IVar56 + 0xda4) == false) {
          pcVar46 = "";
        }
        pcVar47 = "SHIFT ";
        if (*(bool *)((long)IVar56 + 0xda5) == false) {
          pcVar47 = "";
        }
        pcVar42 = "ALT ";
        if (*(bool *)((long)IVar56 + 0xda6) == false) {
          pcVar42 = "";
        }
        Text("Keys mods: %s%s%s%s",pcVar46,pcVar47,pcVar42);
        Text("Chars queue:");
        if (0 < ((ImVector<unsigned_short> *)((long)IVar56 + 0x37c0))->Size) {
          lVar45 = 0;
          do {
            uVar2 = (*(unsigned_short **)((long)IVar56 + 0x37c8))[lVar45];
            SameLine(0.0,-1.0);
            uVar39 = (int)(char)uVar2;
            if (0xde < (ushort)(uVar2 - 0x21)) {
              uVar39 = 0x3f;
            }
            Text("\'%c\' (0x%04X)",(ulong)uVar39,(ulong)uVar2);
            lVar45 = lVar45 + 1;
          } while (lVar45 < ((ImVector<unsigned_short> *)((long)IVar56 + 0x37c0))->Size);
        }
        uVar72 = 0;
        Text("NavInputs down:");
        do {
          if (0.0 < ((float *)((long)IVar56 + 0xda8))[uVar72]) {
            SameLine(0.0,-1.0);
            Text("[%d] %.2f (%.02f secs)",(double)((float *)((long)IVar56 + 0xda8))[uVar72],
                 uVar72 & 0xffffffff);
          }
          uVar72 = uVar72 + 1;
        } while (uVar72 != 0x14);
        Text("NavInputs pressed:");
        uVar72 = 0;
        do {
          if ((((float *)((long)IVar56 + 0x3714))[uVar72] == 0.0) &&
             (!NAN(((float *)((long)IVar56 + 0x3714))[uVar72]))) {
            SameLine(0.0,-1.0);
            Text("[%d]",uVar72 & 0xffffffff);
          }
          uVar72 = uVar72 + 1;
        } while (uVar72 != 0x14);
        local_48 = IVar56;
        IVar56 = GetCursorScreenPos();
        fVar52 = IVar56.x;
        fVar54 = IVar56.y;
        local_108._4_4_ = fVar54 + 102.0 + 10.0;
        local_108._0_4_ = fVar52 + 102.0 + 18.0 + 10.0;
        uStack_100._0_4_ = (float)extraout_XMM0_Qb_01 + 0.0 + 0.0;
        uStack_100._4_4_ = (float)((ulong)extraout_XMM0_Qb_01 >> 0x20) + 0.0 + 0.0;
        local_128._0_4_ = fVar52 + 5.0 + -34.0;
        pIVar34 = GetWindowDrawList();
        ImDrawList::PushClipRect(pIVar34,IVar56,(ImVec2)local_108,true);
        lVar45 = 0x10;
        do {
          local_d8._0_4_ =
               (float)*(int *)((long)&PTR_anon_var_dwarf_7261b_001a9840 + lVar45) * 9.0 +
               (float)*(int *)((long)&PTR_anon_var_dwarf_7261b_001a9840 + lVar45 + 4) * 34.0 +
               (float)local_128._0_4_;
          local_d8._4_4_ =
               (float)*(int *)((long)&PTR_anon_var_dwarf_7261b_001a9840 + lVar45) * 34.0 + fVar54;
          local_148.x = (float)local_d8._0_4_ + 35.0;
          local_148.y = (float)local_d8._4_4_ + 35.0;
          ImDrawList::AddRectFilled(pIVar34,(ImVec2 *)local_d8,&local_148,0xffcccccc,3.0,0);
          ImDrawList::AddRect(pIVar34,(ImVec2 *)local_d8,&local_148,0xff181818,3.0,0,1.0);
          local_110.x = (float)local_d8._0_4_ + 5.0;
          local_110.y = (float)local_d8._4_4_ + 3.0;
          local_e8.x = local_110.x + 25.0;
          local_e8.y = local_110.y + 25.0;
          ImDrawList::AddRect(pIVar34,&local_110,&local_e8,0xffc1c1c1,2.0,0,2.0);
          ImDrawList::AddRectFilled(pIVar34,&local_110,&local_e8,0xfffcfcfc,2.0,0);
          local_f8.x = (float)local_d8._0_4_ + 7.0;
          local_f8.y = (float)local_d8._4_4_ + 4.0;
          ImDrawList::AddText(pIVar34,&local_f8,0xff404040,
                              *(char **)((long)&PTR_anon_var_dwarf_72627_001a9848 + lVar45),
                              (char *)0x0);
          bVar26 = IsKeyDown(*(ImGuiKey *)((long)&DAT_001a9850 + lVar45));
          if (bVar26) {
            ImDrawList::AddRectFilled(pIVar34,(ImVec2 *)local_d8,&local_148,0x800000ff,3.0,0);
          }
          lVar45 = lVar45 + 0x18;
        } while (lVar45 != 0x178);
        ImDrawList::PopClipRect(pIVar34);
        local_d8._0_4_ = (float)local_108._0_4_ - fVar52;
        local_d8._4_4_ = (float)local_108._4_4_ - fVar54;
        Dummy((ImVec2 *)local_d8);
        TreePop();
        IVar56 = local_48;
      }
      bVar26 = TreeNode("Capture override");
      if (bVar26) {
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        Button("Hovering me sets the\nkeyboard capture flag",(ImVec2 *)local_d8);
        bVar26 = IsItemHovered(0);
        if (bVar26) {
          CaptureKeyboardFromApp(true);
        }
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        Button("Holding me clears the\nthe keyboard capture flag",(ImVec2 *)local_d8);
        bVar26 = IsItemActive();
        if (bVar26) {
          CaptureKeyboardFromApp(false);
        }
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1696,"Inputs, Navigation & Focus/Tabbing",GImGuiDemoMarkerCallbackUserData);
      }
      bVar26 = TreeNode("Tabbing");
      if (bVar26) {
        Text("Use TAB/SHIFT+TAB to cycle through keyboard editable fields.");
        InputText("1",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        InputText("2",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        InputText("3",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        PushAllowKeyboardFocus(false);
        InputText("4 (tab skip)",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,
                  (void *)0x0);
        SameLine(0.0,-1.0);
        HelpMarker("Item won\'t be cycled through when using TAB or Shift+Tab.");
        PopAllowKeyboardFocus();
        InputText("5",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x16a6,"Inputs, Navigation & Focus/Focus from code",
                   GImGuiDemoMarkerCallbackUserData);
      }
      bVar26 = TreeNode("Focus from code");
      if (bVar26) {
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Focus on 1",(ImVec2 *)local_d8);
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar27 = Button("Focus on 2",(ImVec2 *)local_d8);
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar28 = Button("Focus on 3",(ImVec2 *)local_d8);
        if (bVar26) {
          SetKeyboardFocusHere(0);
        }
        InputText("1",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        bVar26 = IsItemActive();
        uVar39 = (uint)bVar26;
        if (bVar27) {
          SetKeyboardFocusHere(0);
        }
        InputText("2",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        bVar26 = IsItemActive();
        if (bVar26) {
          uVar39 = 2;
        }
        PushAllowKeyboardFocus(false);
        if (bVar28) {
          SetKeyboardFocusHere(0);
        }
        InputText("3 (tab skip)",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,
                  (void *)0x0);
        bVar26 = IsItemActive();
        if (bVar26) {
          uVar39 = 3;
        }
        SameLine(0.0,-1.0);
        HelpMarker("Item won\'t be cycled through when using TAB or Shift+Tab.");
        PopAllowKeyboardFocus();
        if (uVar39 == 0) {
          Text("Item with focus: <none>");
        }
        else {
          Text("Item with focus: %d",(ulong)uVar39);
        }
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Focus on X",(ImVec2 *)local_d8);
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar27 = Button("Focus on Y",(ImVec2 *)local_d8);
        iVar43 = 1;
        if (!bVar27) {
          iVar43 = bVar26 - 1;
        }
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar26 = Button("Focus on Z",(ImVec2 *)local_d8);
        iVar68 = 2;
        if (!bVar26) {
          iVar68 = iVar43;
        }
        if (iVar68 != -1) {
          SetKeyboardFocusHere(iVar68);
        }
        SliderFloat3("Float3",(float *)ShowDemoWindowMisc()::f3,0.0,1.0,"%.3f",0);
        TextWrapped("NB: Cursor & selection are preserved when refocusing last used item in code.");
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x16d0,"Inputs, Navigation & Focus/Dragging",GImGuiDemoMarkerCallbackUserData);
      }
      bVar26 = TreeNode("Dragging");
      if (bVar26) {
        TextWrapped(
                   "You can use ImGui::GetMouseDragDelta(0) to query for the dragged amount on any widget."
                   );
        uVar39 = 0;
        do {
          Text("IsMouseDragging(%d):",(ulong)uVar39);
          bVar26 = IsMouseDragging(uVar39,-1.0);
          Text("  w/ default threshold: %d,",(ulong)bVar26);
          bVar26 = IsMouseDragging(uVar39,0.0);
          Text("  w/ zero threshold: %d,",(ulong)bVar26);
          bVar26 = IsMouseDragging(uVar39,20.0);
          Text("  w/ large threshold: %d,",(ulong)bVar26);
          uVar39 = uVar39 + 1;
        } while (uVar39 != 3);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        Button("Drag Me",(ImVec2 *)local_d8);
        bVar26 = IsItemActive();
        if (bVar26) {
          pIVar34 = GetForegroundDrawList();
          IVar29 = GetColorU32(0x15,1.0);
          ImDrawList::AddLine(pIVar34,(ImVec2 *)((long)IVar56 + 0x3658),
                              (ImVec2 *)((long)IVar56 + 0xd8c),IVar29,4.0);
        }
        IVar57 = GetMouseDragDelta(0,0.0);
        uStack_100 = extraout_XMM0_Qb_02;
        local_108._0_4_ = IVar57.x;
        local_108._4_4_ = IVar57.y;
        local_48 = GetMouseDragDelta(0,-1.0);
        fVar52 = ((ImVec2 *)((long)IVar56 + 0xe8))->x;
        local_128 = (undefined1  [8])(double)*(float *)((long)IVar56 + 0xec);
        uStack_40 = extraout_XMM0_Qb_03;
        Text("GetMouseDragDelta(0):");
        Text("  w/ default threshold: (%.1f, %.1f)",(double)local_48.x,(double)local_48.y);
        Text("  w/ zero threshold: (%.1f, %.1f)",(double)(float)local_108._0_4_,
             (double)(float)local_108._4_4_);
        Text("io.MouseDelta: (%.1f, %.1f)",(double)fVar52,local_128);
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x16ed,"Inputs, Navigation & Focus/Mouse cursors",
                   GImGuiDemoMarkerCallbackUserData);
      }
      bVar26 = TreeNode("Mouse cursors");
      if (bVar26) {
        IVar31 = GetMouseCursor();
        puVar49 = &DAT_001a99c0;
        Text("Current mouse cursor = %d: %s",(long)IVar31,(&DAT_001a99c0)[IVar31]);
        Text("Hover to see mouse cursors:");
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Your application can render a different mouse cursor based on what ImGui::GetMouseCursor() returns. If software cursor rendering (io.MouseDrawCursor) is set ImGui will draw the right cursor for you, otherwise your backend needs to handle it."
                  );
        uVar72 = 0;
        do {
          sprintf(local_d8,"Mouse cursor %d: %s",uVar72 & 0xffffffff,*puVar49);
          Bullet();
          local_148.x = 0.0;
          local_148.y = 0.0;
          Selectable(local_d8,false,0,&local_148);
          bVar26 = IsItemHovered(0);
          if (bVar26) {
            SetMouseCursor((ImGuiMouseCursor)uVar72);
          }
          uVar72 = uVar72 + 1;
          puVar49 = puVar49 + 1;
        } while (uVar72 != 9);
        TreePop();
      }
    }
    PopItemWidth();
  }
  End();
  return;
}

Assistant:

void ImGui::ShowDemoWindow(bool* p_open)
{
    // Exceptionally add an extra assert here for people confused about initial Dear ImGui setup
    // Most ImGui functions would normally just crash if the context is missing.
    IM_ASSERT(ImGui::GetCurrentContext() != NULL && "Missing dear imgui context. Refer to examples app!");

    // Examples Apps (accessible from the "Examples" menu)
    static bool show_app_main_menu_bar = false;
    static bool show_app_documents = false;

    static bool show_app_console = false;
    static bool show_app_log = false;
    static bool show_app_layout = false;
    static bool show_app_property_editor = false;
    static bool show_app_long_text = false;
    static bool show_app_auto_resize = false;
    static bool show_app_constrained_resize = false;
    static bool show_app_simple_overlay = false;
    static bool show_app_fullscreen = false;
    static bool show_app_window_titles = false;
    static bool show_app_custom_rendering = false;

    if (show_app_main_menu_bar)       ShowExampleAppMainMenuBar();
    if (show_app_documents)           ShowExampleAppDocuments(&show_app_documents);

    if (show_app_console)             ShowExampleAppConsole(&show_app_console);
    if (show_app_log)                 ShowExampleAppLog(&show_app_log);
    if (show_app_layout)              ShowExampleAppLayout(&show_app_layout);
    if (show_app_property_editor)     ShowExampleAppPropertyEditor(&show_app_property_editor);
    if (show_app_long_text)           ShowExampleAppLongText(&show_app_long_text);
    if (show_app_auto_resize)         ShowExampleAppAutoResize(&show_app_auto_resize);
    if (show_app_constrained_resize)  ShowExampleAppConstrainedResize(&show_app_constrained_resize);
    if (show_app_simple_overlay)      ShowExampleAppSimpleOverlay(&show_app_simple_overlay);
    if (show_app_fullscreen)          ShowExampleAppFullscreen(&show_app_fullscreen);
    if (show_app_window_titles)       ShowExampleAppWindowTitles(&show_app_window_titles);
    if (show_app_custom_rendering)    ShowExampleAppCustomRendering(&show_app_custom_rendering);

    // Dear ImGui Apps (accessible from the "Tools" menu)
    static bool show_app_metrics = false;
    static bool show_app_stack_tool = false;
    static bool show_app_style_editor = false;
    static bool show_app_about = false;

    if (show_app_metrics)       { ImGui::ShowMetricsWindow(&show_app_metrics); }
    if (show_app_stack_tool)    { ImGui::ShowStackToolWindow(&show_app_stack_tool); }
    if (show_app_about)         { ImGui::ShowAboutWindow(&show_app_about); }
    if (show_app_style_editor)
    {
        ImGui::Begin("Dear ImGui Style Editor", &show_app_style_editor);
        ImGui::ShowStyleEditor();
        ImGui::End();
    }

    // Demonstrate the various window flags. Typically you would just use the default!
    static bool no_titlebar = false;
    static bool no_scrollbar = false;
    static bool no_menu = false;
    static bool no_move = false;
    static bool no_resize = false;
    static bool no_collapse = false;
    static bool no_close = false;
    static bool no_nav = false;
    static bool no_background = false;
    static bool no_bring_to_front = false;
    static bool unsaved_document = false;

    ImGuiWindowFlags window_flags = 0;
    if (no_titlebar)        window_flags |= ImGuiWindowFlags_NoTitleBar;
    if (no_scrollbar)       window_flags |= ImGuiWindowFlags_NoScrollbar;
    if (!no_menu)           window_flags |= ImGuiWindowFlags_MenuBar;
    if (no_move)            window_flags |= ImGuiWindowFlags_NoMove;
    if (no_resize)          window_flags |= ImGuiWindowFlags_NoResize;
    if (no_collapse)        window_flags |= ImGuiWindowFlags_NoCollapse;
    if (no_nav)             window_flags |= ImGuiWindowFlags_NoNav;
    if (no_background)      window_flags |= ImGuiWindowFlags_NoBackground;
    if (no_bring_to_front)  window_flags |= ImGuiWindowFlags_NoBringToFrontOnFocus;
    if (unsaved_document)   window_flags |= ImGuiWindowFlags_UnsavedDocument;
    if (no_close)           p_open = NULL; // Don't pass our bool* to Begin

    // We specify a default position/size in case there's no data in the .ini file.
    // We only do it to make the demo applications a little more welcoming, but typically this isn't required.
    const ImGuiViewport* main_viewport = ImGui::GetMainViewport();
    ImGui::SetNextWindowPos(ImVec2(main_viewport->WorkPos.x + 650, main_viewport->WorkPos.y + 20), ImGuiCond_FirstUseEver);
    ImGui::SetNextWindowSize(ImVec2(550, 680), ImGuiCond_FirstUseEver);

    // Main body of the Demo window starts here.
    if (!ImGui::Begin("Dear ImGui Demo", p_open, window_flags))
    {
        // Early out if the window is collapsed, as an optimization.
        ImGui::End();
        return;
    }

    // Most "big" widgets share a common width settings by default. See 'Demo->Layout->Widgets Width' for details.

    // e.g. Use 2/3 of the space for widgets and 1/3 for labels (right align)
    //ImGui::PushItemWidth(-ImGui::GetWindowWidth() * 0.35f);

    // e.g. Leave a fixed amount of width for labels (by passing a negative value), the rest goes to widgets.
    ImGui::PushItemWidth(ImGui::GetFontSize() * -12);

    // Menu Bar
    if (ImGui::BeginMenuBar())
    {
        if (ImGui::BeginMenu("Menu"))
        {
            IMGUI_DEMO_MARKER("Menu/File");
            ShowExampleMenuFile();
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Examples"))
        {
            IMGUI_DEMO_MARKER("Menu/Examples");
            ImGui::MenuItem("Main menu bar", NULL, &show_app_main_menu_bar);
            ImGui::MenuItem("Console", NULL, &show_app_console);
            ImGui::MenuItem("Log", NULL, &show_app_log);
            ImGui::MenuItem("Simple layout", NULL, &show_app_layout);
            ImGui::MenuItem("Property editor", NULL, &show_app_property_editor);
            ImGui::MenuItem("Long text display", NULL, &show_app_long_text);
            ImGui::MenuItem("Auto-resizing window", NULL, &show_app_auto_resize);
            ImGui::MenuItem("Constrained-resizing window", NULL, &show_app_constrained_resize);
            ImGui::MenuItem("Simple overlay", NULL, &show_app_simple_overlay);
            ImGui::MenuItem("Fullscreen window", NULL, &show_app_fullscreen);
            ImGui::MenuItem("Manipulating window titles", NULL, &show_app_window_titles);
            ImGui::MenuItem("Custom rendering", NULL, &show_app_custom_rendering);
            ImGui::MenuItem("Documents", NULL, &show_app_documents);
            ImGui::EndMenu();
        }
        //if (ImGui::MenuItem("MenuItem")) {} // You can also use MenuItem() inside a menu bar!
        if (ImGui::BeginMenu("Tools"))
        {
            IMGUI_DEMO_MARKER("Menu/Tools");
#ifndef IMGUI_DISABLE_METRICS_WINDOW
            ImGui::MenuItem("Metrics/Debugger", NULL, &show_app_metrics);
            ImGui::MenuItem("Stack Tool", NULL, &show_app_stack_tool);
#endif
            ImGui::MenuItem("Style Editor", NULL, &show_app_style_editor);
            ImGui::MenuItem("About Dear ImGui", NULL, &show_app_about);
            ImGui::EndMenu();
        }
        ImGui::EndMenuBar();
    }

    ImGui::Text("dear imgui says hello. (%s)", IMGUI_VERSION);
    ImGui::Spacing();

    IMGUI_DEMO_MARKER("Help");
    if (ImGui::CollapsingHeader("Help"))
    {
        ImGui::Text("ABOUT THIS DEMO:");
        ImGui::BulletText("Sections below are demonstrating many aspects of the library.");
        ImGui::BulletText("The \"Examples\" menu above leads to more demo contents.");
        ImGui::BulletText("The \"Tools\" menu above gives access to: About Box, Style Editor,\n"
                          "and Metrics/Debugger (general purpose Dear ImGui debugging tool).");
        ImGui::Separator();

        ImGui::Text("PROGRAMMER GUIDE:");
        ImGui::BulletText("See the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
        ImGui::BulletText("See comments in imgui.cpp.");
        ImGui::BulletText("See example applications in the examples/ folder.");
        ImGui::BulletText("Read the FAQ at http://www.dearimgui.org/faq/");
        ImGui::BulletText("Set 'io.ConfigFlags |= NavEnableKeyboard' for keyboard controls.");
        ImGui::BulletText("Set 'io.ConfigFlags |= NavEnableGamepad' for gamepad controls.");
        ImGui::Separator();

        ImGui::Text("USER GUIDE:");
        ImGui::ShowUserGuide();
    }

    IMGUI_DEMO_MARKER("Configuration");
    if (ImGui::CollapsingHeader("Configuration"))
    {
        ImGuiIO& io = ImGui::GetIO();

        if (ImGui::TreeNode("Configuration##2"))
        {
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",    &io.ConfigFlags, ImGuiConfigFlags_NavEnableKeyboard);
            ImGui::SameLine(); HelpMarker("Enable keyboard controls.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableGamepad",     &io.ConfigFlags, ImGuiConfigFlags_NavEnableGamepad);
            ImGui::SameLine(); HelpMarker("Enable gamepad controls. Require backend to set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos", &io.ConfigFlags, ImGuiConfigFlags_NavEnableSetMousePos);
            ImGui::SameLine(); HelpMarker("Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos.");
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouse",              &io.ConfigFlags, ImGuiConfigFlags_NoMouse);
            if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)
            {
                // The "NoMouse" option can get us stuck with a disabled mouse! Let's provide an alternative way to fix it:
                if (fmodf((float)ImGui::GetTime(), 0.40f) < 0.20f)
                {
                    ImGui::SameLine();
                    ImGui::Text("<<PRESS SPACE TO DISABLE>>");
                }
                if (ImGui::IsKeyPressed(ImGuiKey_Space))
                    io.ConfigFlags &= ~ImGuiConfigFlags_NoMouse;
            }
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouseCursorChange", &io.ConfigFlags, ImGuiConfigFlags_NoMouseCursorChange);
            ImGui::SameLine(); HelpMarker("Instruct backend to not alter mouse cursor shape and visibility.");
            ImGui::Checkbox("io.ConfigInputTrickleEventQueue", &io.ConfigInputTrickleEventQueue);
            ImGui::SameLine(); HelpMarker("Enable input queue trickling: some types of events submitted during the same frame (e.g. button down + up) will be spread over multiple frames, improving interactions with low framerates.");
            ImGui::Checkbox("io.ConfigInputTextCursorBlink", &io.ConfigInputTextCursorBlink);
            ImGui::SameLine(); HelpMarker("Enable blinking cursor (optional as some users consider it to be distracting).");
            ImGui::Checkbox("io.ConfigDragClickToInputText", &io.ConfigDragClickToInputText);
            ImGui::SameLine(); HelpMarker("Enable turning DragXXX widgets into text input with a simple mouse click-release (without moving).");
            ImGui::Checkbox("io.ConfigWindowsResizeFromEdges", &io.ConfigWindowsResizeFromEdges);
            ImGui::SameLine(); HelpMarker("Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback.");
            ImGui::Checkbox("io.ConfigWindowsMoveFromTitleBarOnly", &io.ConfigWindowsMoveFromTitleBarOnly);
            ImGui::Checkbox("io.MouseDrawCursor", &io.MouseDrawCursor);
            ImGui::SameLine(); HelpMarker("Instruct Dear ImGui to render a mouse cursor itself. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something).");
            ImGui::Text("Also see Style->Rendering for rendering options.");
            ImGui::TreePop();
            ImGui::Separator();
        }

        IMGUI_DEMO_MARKER("Configuration/Backend Flags");
        if (ImGui::TreeNode("Backend Flags"))
        {
            HelpMarker(
                "Those flags are set by the backends (imgui_impl_xxx files) to specify their capabilities.\n"
                "Here we expose them as read-only fields to avoid breaking interactions with your backend.");

            // Make a local copy to avoid modifying actual backend flags.
            // FIXME: We don't use BeginDisabled() to keep label bright, maybe we need a BeginReadonly() equivalent..
            ImGuiBackendFlags backend_flags = io.BackendFlags;
            ImGui::CheckboxFlags("io.BackendFlags: HasGamepad",           &backend_flags, ImGuiBackendFlags_HasGamepad);
            ImGui::CheckboxFlags("io.BackendFlags: HasMouseCursors",      &backend_flags, ImGuiBackendFlags_HasMouseCursors);
            ImGui::CheckboxFlags("io.BackendFlags: HasSetMousePos",       &backend_flags, ImGuiBackendFlags_HasSetMousePos);
            ImGui::CheckboxFlags("io.BackendFlags: RendererHasVtxOffset", &backend_flags, ImGuiBackendFlags_RendererHasVtxOffset);
            ImGui::TreePop();
            ImGui::Separator();
        }

        IMGUI_DEMO_MARKER("Configuration/Style");
        if (ImGui::TreeNode("Style"))
        {
            HelpMarker("The same contents can be accessed in 'Tools->Style Editor' or by calling the ShowStyleEditor() function.");
            ImGui::ShowStyleEditor();
            ImGui::TreePop();
            ImGui::Separator();
        }

        IMGUI_DEMO_MARKER("Configuration/Capture, Logging");
        if (ImGui::TreeNode("Capture/Logging"))
        {
            HelpMarker(
                "The logging API redirects all text output so you can easily capture the content of "
                "a window or a block. Tree nodes can be automatically expanded.\n"
                "Try opening any of the contents below in this window and then click one of the \"Log To\" button.");
            ImGui::LogButtons();

            HelpMarker("You can also call ImGui::LogText() to output directly to the log without a visual output.");
            if (ImGui::Button("Copy \"Hello, world!\" to clipboard"))
            {
                ImGui::LogToClipboard();
                ImGui::LogText("Hello, world!");
                ImGui::LogFinish();
            }
            ImGui::TreePop();
        }
    }

    IMGUI_DEMO_MARKER("Window options");
    if (ImGui::CollapsingHeader("Window options"))
    {
        if (ImGui::BeginTable("split", 3))
        {
            ImGui::TableNextColumn(); ImGui::Checkbox("No titlebar", &no_titlebar);
            ImGui::TableNextColumn(); ImGui::Checkbox("No scrollbar", &no_scrollbar);
            ImGui::TableNextColumn(); ImGui::Checkbox("No menu", &no_menu);
            ImGui::TableNextColumn(); ImGui::Checkbox("No move", &no_move);
            ImGui::TableNextColumn(); ImGui::Checkbox("No resize", &no_resize);
            ImGui::TableNextColumn(); ImGui::Checkbox("No collapse", &no_collapse);
            ImGui::TableNextColumn(); ImGui::Checkbox("No close", &no_close);
            ImGui::TableNextColumn(); ImGui::Checkbox("No nav", &no_nav);
            ImGui::TableNextColumn(); ImGui::Checkbox("No background", &no_background);
            ImGui::TableNextColumn(); ImGui::Checkbox("No bring to front", &no_bring_to_front);
            ImGui::TableNextColumn(); ImGui::Checkbox("Unsaved document", &unsaved_document);
            ImGui::EndTable();
        }
    }

    // All demo contents
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    ShowDemoWindowPopups();
    ShowDemoWindowTables();
    ShowDemoWindowMisc();

    // End of ShowDemoWindow()
    ImGui::PopItemWidth();
    ImGui::End();
}